

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<4,8>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  void *pvVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  uint uVar48;
  int iVar49;
  ulong uVar50;
  byte bVar51;
  uint uVar52;
  long lVar53;
  uint uVar54;
  uint uVar55;
  ulong uVar57;
  ulong uVar58;
  bool bVar59;
  float fVar60;
  undefined4 uVar61;
  float fVar62;
  float fVar87;
  float fVar89;
  vint4 bi_2;
  undefined1 auVar63 [16];
  float fVar91;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar88;
  float fVar90;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar92;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined8 uVar93;
  vint4 bi_1;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar123;
  vint4 ai_2;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar138;
  float fVar147;
  vint4 ai;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  vint4 bi;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  float fVar163;
  float fVar164;
  float fVar181;
  float fVar182;
  vfloat4 b0_1;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar183;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  float fVar195;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar187 [16];
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar196;
  undefined1 auVar194 [32];
  float fVar200;
  float fVar212;
  vint4 ai_1;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar213;
  float fVar228;
  vfloat4 a0_2;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar229;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  vfloat4 a0_3;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar248;
  float fVar262;
  float fVar263;
  vfloat4 a0_1;
  undefined1 auVar253 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar264;
  undefined1 auVar251 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar252 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  vfloat4 a0;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar289 [32];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_700 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  undefined4 local_530;
  undefined4 local_520;
  uint auStack_500 [4];
  RTCFilterFunctionNArguments local_4f0;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  uint uStack_320;
  float afStack_31c [7];
  undefined1 local_300 [32];
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  uint local_2c0;
  uint uStack_2bc;
  uint uStack_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  uint uStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar56;
  undefined1 auVar288 [32];
  
  PVar3 = prim[1];
  uVar57 = (ulong)(byte)PVar3;
  fVar60 = *(float *)(prim + uVar57 * 0x19 + 0x12);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar8 = vsubps_avx(auVar8,*(undefined1 (*) [16])(prim + uVar57 * 0x19 + 6));
  auVar63._0_4_ = fVar60 * auVar8._0_4_;
  auVar63._4_4_ = fVar60 * auVar8._4_4_;
  auVar63._8_4_ = fVar60 * auVar8._8_4_;
  auVar63._12_4_ = fVar60 * auVar8._12_4_;
  auVar75._0_4_ = fVar60 * auVar9._0_4_;
  auVar75._4_4_ = fVar60 * auVar9._4_4_;
  auVar75._8_4_ = fVar60 * auVar9._8_4_;
  auVar75._12_4_ = fVar60 * auVar9._12_4_;
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 4 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar285 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 6 + 6)));
  auVar285 = vcvtdq2ps_avx(auVar285);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar57 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  uVar50 = (ulong)(uint)((int)(uVar57 * 9) * 2);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 + uVar57 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  uVar50 = (ulong)(uint)((int)(uVar57 * 5) << 2);
  auVar113 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 + 6)));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar274._4_4_ = auVar75._0_4_;
  auVar274._0_4_ = auVar75._0_4_;
  auVar274._8_4_ = auVar75._0_4_;
  auVar274._12_4_ = auVar75._0_4_;
  auVar95 = vshufps_avx(auVar75,auVar75,0x55);
  auVar64 = vshufps_avx(auVar75,auVar75,0xaa);
  fVar60 = auVar64._0_4_;
  auVar242._0_4_ = fVar60 * auVar285._0_4_;
  fVar87 = auVar64._4_4_;
  auVar242._4_4_ = fVar87 * auVar285._4_4_;
  fVar89 = auVar64._8_4_;
  auVar242._8_4_ = fVar89 * auVar285._8_4_;
  fVar91 = auVar64._12_4_;
  auVar242._12_4_ = fVar91 * auVar285._12_4_;
  auVar129._0_4_ = auVar13._0_4_ * fVar60;
  auVar129._4_4_ = auVar13._4_4_ * fVar87;
  auVar129._8_4_ = auVar13._8_4_ * fVar89;
  auVar129._12_4_ = auVar13._12_4_ * fVar91;
  auVar244._0_4_ = auVar113._0_4_ * fVar60;
  auVar244._4_4_ = auVar113._4_4_ * fVar87;
  auVar244._8_4_ = auVar113._8_4_ * fVar89;
  auVar244._12_4_ = auVar113._12_4_ * fVar91;
  auVar64 = vfmadd231ps_fma(auVar242,auVar95,auVar9);
  auVar96 = vfmadd231ps_fma(auVar129,auVar95,auVar12);
  auVar95 = vfmadd231ps_fma(auVar244,auVar65,auVar95);
  auVar124 = vfmadd231ps_fma(auVar64,auVar274,auVar8);
  auVar96 = vfmadd231ps_fma(auVar96,auVar274,auVar11);
  auVar139 = vfmadd231ps_fma(auVar95,auVar66,auVar274);
  auVar275._4_4_ = auVar63._0_4_;
  auVar275._0_4_ = auVar63._0_4_;
  auVar275._8_4_ = auVar63._0_4_;
  auVar275._12_4_ = auVar63._0_4_;
  auVar95 = vshufps_avx(auVar63,auVar63,0x55);
  auVar64 = vshufps_avx(auVar63,auVar63,0xaa);
  fVar60 = auVar64._0_4_;
  auVar148._0_4_ = fVar60 * auVar285._0_4_;
  fVar87 = auVar64._4_4_;
  auVar148._4_4_ = fVar87 * auVar285._4_4_;
  fVar89 = auVar64._8_4_;
  auVar148._8_4_ = fVar89 * auVar285._8_4_;
  fVar91 = auVar64._12_4_;
  auVar148._12_4_ = fVar91 * auVar285._12_4_;
  auVar94._0_4_ = auVar13._0_4_ * fVar60;
  auVar94._4_4_ = auVar13._4_4_ * fVar87;
  auVar94._8_4_ = auVar13._8_4_ * fVar89;
  auVar94._12_4_ = auVar13._12_4_ * fVar91;
  auVar64._0_4_ = auVar113._0_4_ * fVar60;
  auVar64._4_4_ = auVar113._4_4_ * fVar87;
  auVar64._8_4_ = auVar113._8_4_ * fVar89;
  auVar64._12_4_ = auVar113._12_4_ * fVar91;
  auVar9 = vfmadd231ps_fma(auVar148,auVar95,auVar9);
  auVar285 = vfmadd231ps_fma(auVar94,auVar95,auVar12);
  auVar12 = vfmadd231ps_fma(auVar64,auVar95,auVar65);
  auVar13 = vfmadd231ps_fma(auVar9,auVar275,auVar8);
  auVar65 = vfmadd231ps_fma(auVar285,auVar275,auVar11);
  auVar113 = vfmadd231ps_fma(auVar12,auVar275,auVar66);
  auVar249._8_4_ = 0x7fffffff;
  auVar249._0_8_ = 0x7fffffff7fffffff;
  auVar249._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx(auVar124,auVar249);
  auVar253._8_4_ = 0x219392ef;
  auVar253._0_8_ = 0x219392ef219392ef;
  auVar253._12_4_ = 0x219392ef;
  auVar8 = vcmpps_avx(auVar8,auVar253,1);
  auVar9 = vblendvps_avx(auVar124,auVar253,auVar8);
  auVar8 = vandps_avx(auVar96,auVar249);
  auVar8 = vcmpps_avx(auVar8,auVar253,1);
  auVar285 = vblendvps_avx(auVar96,auVar253,auVar8);
  auVar8 = vandps_avx(auVar139,auVar249);
  auVar8 = vcmpps_avx(auVar8,auVar253,1);
  auVar8 = vblendvps_avx(auVar139,auVar253,auVar8);
  auVar11 = vrcpps_avx(auVar9);
  auVar184._8_4_ = 0x3f800000;
  auVar184._0_8_ = 0x3f8000003f800000;
  auVar184._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar11,auVar184);
  auVar11 = vfmadd132ps_fma(auVar9,auVar11,auVar11);
  auVar9 = vrcpps_avx(auVar285);
  auVar285 = vfnmadd213ps_fma(auVar285,auVar9,auVar184);
  auVar12 = vfmadd132ps_fma(auVar285,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar9,auVar184);
  auVar66 = vfmadd132ps_fma(auVar8,auVar9,auVar9);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar57 * 7 + 6);
  auVar8 = vpmovsxwd_avx(auVar8);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar13);
  auVar139._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar139._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar139._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar139._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar57 * 9 + 6);
  auVar8 = vpmovsxwd_avx(auVar9);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar13);
  auVar149._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar149._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar149._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar149._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar96._1_3_ = 0;
  auVar96[0] = PVar3;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar285);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar57 * -2 + 6);
  auVar8 = vpmovsxwd_avx(auVar11);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar65);
  auVar201._0_4_ = auVar8._0_4_ * auVar12._0_4_;
  auVar201._4_4_ = auVar8._4_4_ * auVar12._4_4_;
  auVar201._8_4_ = auVar8._8_4_ * auVar12._8_4_;
  auVar201._12_4_ = auVar8._12_4_ * auVar12._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar9);
  auVar8 = vsubps_avx(auVar8,auVar65);
  auVar95._0_4_ = auVar12._0_4_ * auVar8._0_4_;
  auVar95._4_4_ = auVar12._4_4_ * auVar8._4_4_;
  auVar95._8_4_ = auVar12._8_4_ * auVar8._8_4_;
  auVar95._12_4_ = auVar12._12_4_ * auVar8._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar50 + uVar57 + 6);
  auVar8 = vpmovsxwd_avx(auVar12);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar113);
  auVar124._0_4_ = auVar66._0_4_ * auVar8._0_4_;
  auVar124._4_4_ = auVar66._4_4_ * auVar8._4_4_;
  auVar124._8_4_ = auVar66._8_4_ * auVar8._8_4_;
  auVar124._12_4_ = auVar66._12_4_ * auVar8._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar57 * 0x17 + 6);
  auVar8 = vpmovsxwd_avx(auVar13);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar113);
  auVar65._0_4_ = auVar66._0_4_ * auVar8._0_4_;
  auVar65._4_4_ = auVar66._4_4_ * auVar8._4_4_;
  auVar65._8_4_ = auVar66._8_4_ * auVar8._8_4_;
  auVar65._12_4_ = auVar66._12_4_ * auVar8._12_4_;
  auVar8 = vpminsd_avx(auVar139,auVar149);
  auVar9 = vpminsd_avx(auVar201,auVar95);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vpminsd_avx(auVar124,auVar65);
  uVar61 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar214._4_4_ = uVar61;
  auVar214._0_4_ = uVar61;
  auVar214._8_4_ = uVar61;
  auVar214._12_4_ = uVar61;
  auVar9 = vmaxps_avx(auVar9,auVar214);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  local_420._0_4_ = auVar8._0_4_ * 0.99999964;
  local_420._4_4_ = auVar8._4_4_ * 0.99999964;
  local_420._8_4_ = auVar8._8_4_ * 0.99999964;
  local_420._12_4_ = auVar8._12_4_ * 0.99999964;
  auVar8 = vpmaxsd_avx(auVar139,auVar149);
  auVar9 = vpmaxsd_avx(auVar201,auVar95);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar9 = vpmaxsd_avx(auVar124,auVar65);
  uVar61 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar113._4_4_ = uVar61;
  auVar113._0_4_ = uVar61;
  auVar113._8_4_ = uVar61;
  auVar113._12_4_ = uVar61;
  auVar9 = vminps_avx(auVar9,auVar113);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar66._0_4_ = auVar8._0_4_ * 1.0000004;
  auVar66._4_4_ = auVar8._4_4_ * 1.0000004;
  auVar66._8_4_ = auVar8._8_4_ * 1.0000004;
  auVar66._12_4_ = auVar8._12_4_ * 1.0000004;
  auVar96[4] = PVar3;
  auVar96._5_3_ = 0;
  auVar96[8] = PVar3;
  auVar96._9_3_ = 0;
  auVar96[0xc] = PVar3;
  auVar96._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar96,_DAT_01f7fcf0);
  auVar8 = vcmpps_avx(local_420,auVar66,2);
  auVar8 = vandps_avx(auVar8,auVar9);
  uVar48 = vmovmskps_avx(auVar8);
  if (uVar48 == 0) {
    return false;
  }
  uVar48 = uVar48 & 0xff;
  auVar83._16_16_ = mm_lookupmask_ps._240_16_;
  auVar83._0_16_ = mm_lookupmask_ps._240_16_;
  local_2a0 = vblendps_avx(auVar83,ZEXT832(0) << 0x20,0x80);
  iVar49 = 1 << ((uint)k & 0x1f);
  auVar84._4_4_ = iVar49;
  auVar84._0_4_ = iVar49;
  auVar84._8_4_ = iVar49;
  auVar84._12_4_ = iVar49;
  auVar84._16_4_ = iVar49;
  auVar84._20_4_ = iVar49;
  auVar84._24_4_ = iVar49;
  auVar84._28_4_ = iVar49;
  auVar15 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar83 = vpand_avx2(auVar84,auVar15);
  local_300 = vpcmpeqd_avx2(auVar83,auVar15);
LAB_0162b10b:
  lVar53 = 0;
  uVar57 = (ulong)uVar48;
  for (uVar50 = uVar57; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
    lVar53 = lVar53 + 1;
  }
  uVar48 = *(uint *)(prim + 2);
  local_2e0 = *(uint *)(prim + lVar53 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar48].ptr;
  uVar50 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_2e0);
  p_Var5 = pGVar4[1].intersectionFilterN;
  pvVar6 = pGVar4[2].userPtr;
  _Var7 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar13 = *(undefined1 (*) [16])(_Var7 + uVar50 * (long)pvVar6);
  auVar8 = *(undefined1 (*) [16])(_Var7 + (uVar50 + 1) * (long)pvVar6);
  auVar9 = *(undefined1 (*) [16])(_Var7 + (uVar50 + 2) * (long)pvVar6);
  pfVar1 = (float *)(_Var7 + (long)pvVar6 * (uVar50 + 3));
  fVar60 = *pfVar1;
  fVar87 = pfVar1[1];
  fVar89 = pfVar1[2];
  fVar91 = pfVar1[3];
  lVar53 = *(long *)&pGVar4[1].time_range.upper;
  auVar285 = *(undefined1 (*) [16])(lVar53 + (long)p_Var5 * uVar50);
  auVar11 = *(undefined1 (*) [16])(lVar53 + (long)p_Var5 * (uVar50 + 1));
  auVar12 = *(undefined1 (*) [16])(lVar53 + (long)p_Var5 * (uVar50 + 2));
  uVar57 = uVar57 - 1 & uVar57;
  pfVar1 = (float *)(lVar53 + (long)p_Var5 * (uVar50 + 3));
  fVar163 = *pfVar1;
  fVar181 = pfVar1[1];
  fVar182 = pfVar1[2];
  fVar183 = pfVar1[3];
  if (uVar57 != 0) {
    uVar58 = uVar57 - 1 & uVar57;
    for (uVar50 = uVar57; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
    }
    if (uVar58 != 0) {
      for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar66 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar66 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar282._8_4_ = 0x80000000;
  auVar282._0_8_ = 0x8000000080000000;
  auVar282._12_4_ = 0x80000000;
  auVar125._0_4_ = fVar163 * -0.0;
  auVar125._4_4_ = fVar181 * -0.0;
  auVar125._8_4_ = fVar182 * -0.0;
  auVar125._12_4_ = fVar183 * -0.0;
  auVar65 = vfmadd213ps_fma((undefined1  [16])0x0,auVar12,auVar125);
  auVar67._0_4_ = auVar11._0_4_ + auVar65._0_4_;
  auVar67._4_4_ = auVar11._4_4_ + auVar65._4_4_;
  auVar67._8_4_ = auVar11._8_4_ + auVar65._8_4_;
  auVar67._12_4_ = auVar11._12_4_ + auVar65._12_4_;
  auVar113 = vfmadd231ps_fma(auVar67,auVar285,auVar282);
  auVar97._12_4_ = 0;
  auVar97._0_12_ = ZEXT812(0);
  auVar97 = auVar97 << 0x20;
  auVar114._0_4_ = fVar163 * 0.0;
  auVar114._4_4_ = fVar181 * 0.0;
  auVar114._8_4_ = fVar182 * 0.0;
  auVar114._12_4_ = fVar183 * 0.0;
  auVar202._8_4_ = 0x3f000000;
  auVar202._0_8_ = 0x3f0000003f000000;
  auVar202._12_4_ = 0x3f000000;
  auVar65 = vfmadd231ps_fma(auVar114,auVar12,auVar202);
  auVar65 = vfmadd231ps_fma(auVar65,auVar11,auVar97);
  auVar96 = vfnmadd231ps_fma(auVar65,auVar285,auVar202);
  auVar276._0_4_ = fVar60 * -0.0;
  auVar276._4_4_ = fVar87 * -0.0;
  auVar276._8_4_ = fVar89 * -0.0;
  auVar276._12_4_ = fVar91 * -0.0;
  auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar9,auVar276);
  auVar265._0_4_ = auVar8._0_4_ + auVar65._0_4_;
  auVar265._4_4_ = auVar8._4_4_ + auVar65._4_4_;
  auVar265._8_4_ = auVar8._8_4_ + auVar65._8_4_;
  auVar265._12_4_ = auVar8._12_4_ + auVar65._12_4_;
  auVar65 = vfmadd231ps_fma(auVar265,auVar13,auVar282);
  auVar250._0_4_ = fVar60 * 0.0;
  auVar250._4_4_ = fVar87 * 0.0;
  auVar250._8_4_ = fVar89 * 0.0;
  auVar250._12_4_ = fVar91 * 0.0;
  auVar95 = vfmadd231ps_fma(auVar250,auVar9,auVar202);
  auVar95 = vfmadd231ps_fma(auVar95,auVar8,auVar97);
  auVar124 = vfnmadd231ps_fma(auVar95,auVar13,auVar202);
  auVar126._0_4_ = auVar12._0_4_ + auVar125._0_4_;
  auVar126._4_4_ = auVar12._4_4_ + auVar125._4_4_;
  auVar126._8_4_ = auVar12._8_4_ + auVar125._8_4_;
  auVar126._12_4_ = auVar12._12_4_ + auVar125._12_4_;
  auVar95 = vfmadd231ps_fma(auVar126,auVar11,auVar97);
  auVar95 = vfmadd231ps_fma(auVar95,auVar285,auVar282);
  auVar140._0_4_ = fVar163 * 0.5;
  auVar140._4_4_ = fVar181 * 0.5;
  auVar140._8_4_ = fVar182 * 0.5;
  auVar140._12_4_ = fVar183 * 0.5;
  auVar12 = vfmadd231ps_fma(auVar140,auVar97,auVar12);
  auVar11 = vfnmadd231ps_fma(auVar12,auVar202,auVar11);
  auVar64 = vfmadd231ps_fma(auVar11,auVar97,auVar285);
  auVar215._0_4_ = auVar276._0_4_ + auVar9._0_4_;
  auVar215._4_4_ = auVar276._4_4_ + auVar9._4_4_;
  auVar215._8_4_ = auVar276._8_4_ + auVar9._8_4_;
  auVar215._12_4_ = auVar276._12_4_ + auVar9._12_4_;
  auVar285 = vfmadd231ps_fma(auVar215,auVar8,auVar97);
  auVar12 = vfmadd231ps_fma(auVar285,auVar13,auVar282);
  auVar230._0_4_ = fVar60 * 0.5;
  auVar230._4_4_ = fVar87 * 0.5;
  auVar230._8_4_ = fVar89 * 0.5;
  auVar230._12_4_ = fVar91 * 0.5;
  auVar9 = vfmadd231ps_fma(auVar230,auVar97,auVar9);
  auVar8 = vfnmadd231ps_fma(auVar9,auVar202,auVar8);
  auVar13 = vfmadd231ps_fma(auVar8,auVar97,auVar13);
  auVar8 = vshufps_avx(auVar96,auVar96,0xc9);
  auVar9 = vshufps_avx(auVar65,auVar65,0xc9);
  fVar123 = auVar96._0_4_;
  auVar165._0_4_ = fVar123 * auVar9._0_4_;
  fVar88 = auVar96._4_4_;
  auVar165._4_4_ = fVar88 * auVar9._4_4_;
  fVar90 = auVar96._8_4_;
  auVar165._8_4_ = fVar90 * auVar9._8_4_;
  fVar164 = auVar96._12_4_;
  auVar165._12_4_ = fVar164 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar165,auVar8,auVar65);
  auVar285 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar124,auVar124,0xc9);
  auVar166._0_4_ = fVar123 * auVar9._0_4_;
  auVar166._4_4_ = fVar88 * auVar9._4_4_;
  auVar166._8_4_ = fVar90 * auVar9._8_4_;
  auVar166._12_4_ = fVar164 * auVar9._12_4_;
  auVar8 = vfmsub231ps_fma(auVar166,auVar8,auVar124);
  auVar11 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar9 = vshufps_avx(auVar12,auVar12,0xc9);
  fVar62 = auVar64._0_4_;
  auVar150._0_4_ = fVar62 * auVar9._0_4_;
  fVar229 = auVar64._4_4_;
  auVar150._4_4_ = fVar229 * auVar9._4_4_;
  fVar138 = auVar64._8_4_;
  auVar150._8_4_ = fVar138 * auVar9._8_4_;
  fVar147 = auVar64._12_4_;
  auVar150._12_4_ = fVar147 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar150,auVar8,auVar12);
  auVar12 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar185._0_4_ = fVar62 * auVar9._0_4_;
  auVar185._4_4_ = fVar229 * auVar9._4_4_;
  auVar185._8_4_ = fVar138 * auVar9._8_4_;
  auVar185._12_4_ = fVar147 * auVar9._12_4_;
  auVar8 = vfmsub231ps_fma(auVar185,auVar8,auVar13);
  auVar13 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vdpps_avx(auVar285,auVar285,0x7f);
  fVar87 = auVar8._0_4_;
  auVar65 = ZEXT416((uint)fVar87);
  auVar9 = vrsqrtss_avx(auVar65,auVar65);
  fVar60 = auVar9._0_4_;
  fVar60 = fVar60 * 1.5 + fVar87 * -0.5 * fVar60 * fVar60 * fVar60;
  auVar9 = vdpps_avx(auVar285,auVar11,0x7f);
  fVar163 = auVar285._0_4_ * fVar60;
  fVar181 = auVar285._4_4_ * fVar60;
  fVar182 = auVar285._8_4_ * fVar60;
  fVar183 = auVar285._12_4_ * fVar60;
  auVar243._0_4_ = auVar11._0_4_ * fVar87;
  auVar243._4_4_ = auVar11._4_4_ * fVar87;
  auVar243._8_4_ = auVar11._8_4_ * fVar87;
  auVar243._12_4_ = auVar11._12_4_ * fVar87;
  fVar87 = auVar9._0_4_;
  auVar203._0_4_ = auVar285._0_4_ * fVar87;
  auVar203._4_4_ = auVar285._4_4_ * fVar87;
  auVar203._8_4_ = auVar285._8_4_ * fVar87;
  auVar203._12_4_ = auVar285._12_4_ * fVar87;
  auVar285 = vsubps_avx(auVar243,auVar203);
  auVar9 = vrcpss_avx(auVar65,auVar65);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar89 = auVar9._0_4_ * auVar8._0_4_;
  auVar8 = vdpps_avx(auVar12,auVar12,0x7f);
  fVar91 = auVar8._0_4_;
  auVar65 = ZEXT416((uint)fVar91);
  auVar9 = vrsqrtss_avx(auVar65,auVar65);
  fVar87 = auVar9._0_4_;
  auVar9 = vdpps_avx(auVar12,auVar13,0x7f);
  fVar87 = fVar87 * 1.5 + fVar91 * -0.5 * fVar87 * fVar87 * fVar87;
  fVar248 = fVar87 * auVar12._0_4_;
  fVar262 = fVar87 * auVar12._4_4_;
  fVar263 = fVar87 * auVar12._8_4_;
  fVar264 = fVar87 * auVar12._12_4_;
  auVar186._0_4_ = fVar91 * auVar13._0_4_;
  auVar186._4_4_ = fVar91 * auVar13._4_4_;
  auVar186._8_4_ = fVar91 * auVar13._8_4_;
  auVar186._12_4_ = fVar91 * auVar13._12_4_;
  fVar91 = auVar9._0_4_;
  auVar151._0_4_ = fVar91 * auVar12._0_4_;
  auVar151._4_4_ = fVar91 * auVar12._4_4_;
  auVar151._8_4_ = fVar91 * auVar12._8_4_;
  auVar151._12_4_ = fVar91 * auVar12._12_4_;
  auVar11 = vsubps_avx(auVar186,auVar151);
  auVar9 = vrcpss_avx(auVar65,auVar65);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar91 = auVar8._0_4_ * auVar9._0_4_;
  auVar8 = vshufps_avx(auVar113,auVar113,0xff);
  auVar216._0_4_ = auVar8._0_4_ * fVar163;
  auVar216._4_4_ = auVar8._4_4_ * fVar181;
  auVar216._8_4_ = auVar8._8_4_ * fVar182;
  auVar216._12_4_ = auVar8._12_4_ * fVar183;
  auVar65 = vsubps_avx(auVar113,auVar216);
  auVar9 = vshufps_avx(auVar96,auVar96,0xff);
  auVar167._0_4_ = auVar9._0_4_ * fVar163 + fVar60 * auVar285._0_4_ * fVar89 * auVar8._0_4_;
  auVar167._4_4_ = auVar9._4_4_ * fVar181 + fVar60 * auVar285._4_4_ * fVar89 * auVar8._4_4_;
  auVar167._8_4_ = auVar9._8_4_ * fVar182 + fVar60 * auVar285._8_4_ * fVar89 * auVar8._8_4_;
  auVar167._12_4_ = auVar9._12_4_ * fVar183 + fVar60 * auVar285._12_4_ * fVar89 * auVar8._12_4_;
  auVar285 = vsubps_avx(auVar96,auVar167);
  auVar231._0_4_ = auVar216._0_4_ + auVar113._0_4_;
  auVar231._4_4_ = auVar216._4_4_ + auVar113._4_4_;
  auVar231._8_4_ = auVar216._8_4_ + auVar113._8_4_;
  auVar231._12_4_ = auVar216._12_4_ + auVar113._12_4_;
  auVar8 = vshufps_avx(auVar95,auVar95,0xff);
  auVar115._0_4_ = fVar248 * auVar8._0_4_;
  auVar115._4_4_ = fVar262 * auVar8._4_4_;
  auVar115._8_4_ = fVar263 * auVar8._8_4_;
  auVar115._12_4_ = fVar264 * auVar8._12_4_;
  auVar113 = vsubps_avx(auVar95,auVar115);
  auVar9 = vshufps_avx(auVar64,auVar64,0xff);
  auVar98._0_4_ = fVar248 * auVar9._0_4_ + auVar8._0_4_ * fVar87 * auVar11._0_4_ * fVar91;
  auVar98._4_4_ = fVar262 * auVar9._4_4_ + auVar8._4_4_ * fVar87 * auVar11._4_4_ * fVar91;
  auVar98._8_4_ = fVar263 * auVar9._8_4_ + auVar8._8_4_ * fVar87 * auVar11._8_4_ * fVar91;
  auVar98._12_4_ = fVar264 * auVar9._12_4_ + auVar8._12_4_ * fVar87 * auVar11._12_4_ * fVar91;
  auVar8 = vsubps_avx(auVar64,auVar98);
  fVar163 = auVar95._0_4_ + auVar115._0_4_;
  fVar181 = auVar95._4_4_ + auVar115._4_4_;
  fVar182 = auVar95._8_4_ + auVar115._8_4_;
  fVar183 = auVar95._12_4_ + auVar115._12_4_;
  auVar127._0_4_ = auVar65._0_4_ + auVar285._0_4_ * 0.33333334;
  auVar127._4_4_ = auVar65._4_4_ + auVar285._4_4_ * 0.33333334;
  auVar127._8_4_ = auVar65._8_4_ + auVar285._8_4_ * 0.33333334;
  auVar127._12_4_ = auVar65._12_4_ + auVar285._12_4_ * 0.33333334;
  auVar99._0_4_ = auVar8._0_4_ * 0.33333334;
  auVar99._4_4_ = auVar8._4_4_ * 0.33333334;
  auVar99._8_4_ = auVar8._8_4_ * 0.33333334;
  auVar99._12_4_ = auVar8._12_4_ * 0.33333334;
  auVar95 = vsubps_avx(auVar113,auVar99);
  auVar64 = vsubps_avx(auVar65,auVar66);
  auVar8 = vshufps_avx(auVar64,auVar64,0x55);
  auVar9 = vshufps_avx(auVar64,auVar64,0xaa);
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar60 = pre->ray_space[k].vz.field_0.m128[0];
  fVar87 = pre->ray_space[k].vz.field_0.m128[1];
  fVar89 = pre->ray_space[k].vz.field_0.m128[2];
  fVar91 = pre->ray_space[k].vz.field_0.m128[3];
  auVar100._0_4_ = fVar60 * auVar9._0_4_;
  auVar100._4_4_ = fVar87 * auVar9._4_4_;
  auVar100._8_4_ = fVar89 * auVar9._8_4_;
  auVar100._12_4_ = fVar91 * auVar9._12_4_;
  auVar285 = vfmadd231ps_fma(auVar100,(undefined1  [16])aVar2,auVar8);
  auVar96 = vsubps_avx(auVar127,auVar66);
  auVar8 = vshufps_avx(auVar96,auVar96,0x55);
  auVar9 = vshufps_avx(auVar96,auVar96,0xaa);
  auVar283._0_4_ = fVar60 * auVar9._0_4_;
  auVar283._4_4_ = fVar87 * auVar9._4_4_;
  auVar283._8_4_ = fVar89 * auVar9._8_4_;
  auVar283._12_4_ = fVar91 * auVar9._12_4_;
  auVar9 = vfmadd231ps_fma(auVar283,(undefined1  [16])aVar2,auVar8);
  local_3b0 = vsubps_avx(auVar95,auVar66);
  auVar8 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar251._0_4_ = fVar60 * auVar8._0_4_;
  auVar251._4_4_ = fVar87 * auVar8._4_4_;
  auVar251._8_4_ = fVar89 * auVar8._8_4_;
  auVar251._12_4_ = fVar91 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_3b0,local_3b0,0x55);
  auVar11 = vfmadd231ps_fma(auVar251,(undefined1  [16])aVar2,auVar8);
  local_3c0 = vsubps_avx(auVar113,auVar66);
  auVar8 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar266._0_4_ = fVar60 * auVar8._0_4_;
  auVar266._4_4_ = fVar87 * auVar8._4_4_;
  auVar266._8_4_ = fVar89 * auVar8._8_4_;
  auVar266._12_4_ = fVar91 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_3c0,local_3c0,0x55);
  auVar12 = vfmadd231ps_fma(auVar266,(undefined1  [16])aVar2,auVar8);
  local_3d0 = vsubps_avx(auVar231,auVar66);
  auVar8 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar152._0_4_ = fVar60 * auVar8._0_4_;
  auVar152._4_4_ = fVar87 * auVar8._4_4_;
  auVar152._8_4_ = fVar89 * auVar8._8_4_;
  auVar152._12_4_ = fVar91 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_3d0,local_3d0,0x55);
  auVar13 = vfmadd231ps_fma(auVar152,(undefined1  [16])aVar2,auVar8);
  auVar68._0_4_ = (fVar123 + auVar167._0_4_) * 0.33333334 + auVar231._0_4_;
  auVar68._4_4_ = (fVar88 + auVar167._4_4_) * 0.33333334 + auVar231._4_4_;
  auVar68._8_4_ = (fVar90 + auVar167._8_4_) * 0.33333334 + auVar231._8_4_;
  auVar68._12_4_ = (fVar164 + auVar167._12_4_) * 0.33333334 + auVar231._12_4_;
  local_3e0 = vsubps_avx(auVar68,auVar66);
  auVar8 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar204._0_4_ = auVar8._0_4_ * fVar60;
  auVar204._4_4_ = auVar8._4_4_ * fVar87;
  auVar204._8_4_ = auVar8._8_4_ * fVar89;
  auVar204._12_4_ = auVar8._12_4_ * fVar91;
  auVar8 = vshufps_avx(local_3e0,local_3e0,0x55);
  auVar139 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar2,auVar8);
  auVar217._0_4_ = (fVar62 + auVar98._0_4_) * 0.33333334;
  auVar217._4_4_ = (fVar229 + auVar98._4_4_) * 0.33333334;
  auVar217._8_4_ = (fVar138 + auVar98._8_4_) * 0.33333334;
  auVar217._12_4_ = (fVar147 + auVar98._12_4_) * 0.33333334;
  auVar233._4_4_ = fVar181;
  auVar233._0_4_ = fVar163;
  auVar233._8_4_ = fVar182;
  auVar233._12_4_ = fVar183;
  auVar124 = vsubps_avx(auVar233,auVar217);
  local_3f0 = vsubps_avx(auVar124,auVar66);
  auVar8 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar218._0_4_ = auVar8._0_4_ * fVar60;
  auVar218._4_4_ = auVar8._4_4_ * fVar87;
  auVar218._8_4_ = auVar8._8_4_ * fVar89;
  auVar218._12_4_ = auVar8._12_4_ * fVar91;
  auVar8 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar63 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar2,auVar8);
  local_400 = vsubps_avx(auVar233,auVar66);
  auVar8 = vshufps_avx(local_400,local_400,0xaa);
  auVar69._0_4_ = fVar60 * auVar8._0_4_;
  auVar69._4_4_ = fVar87 * auVar8._4_4_;
  auVar69._8_4_ = fVar89 * auVar8._8_4_;
  auVar69._12_4_ = fVar91 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_400,local_400,0x55);
  auVar8 = vfmadd231ps_fma(auVar69,(undefined1  [16])aVar2,auVar8);
  local_520 = auVar64._0_4_;
  auVar168._4_4_ = local_520;
  auVar168._0_4_ = local_520;
  auVar168._8_4_ = local_520;
  auVar168._12_4_ = local_520;
  aVar2 = pre->ray_space[k].vx.field_0;
  auVar66 = vfmadd231ps_fma(auVar285,(undefined1  [16])aVar2,auVar168);
  local_530 = auVar96._0_4_;
  auVar169._4_4_ = local_530;
  auVar169._0_4_ = local_530;
  auVar169._8_4_ = local_530;
  auVar169._12_4_ = local_530;
  auVar94 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar169);
  uVar61 = local_3b0._0_4_;
  auVar170._4_4_ = uVar61;
  auVar170._0_4_ = uVar61;
  auVar170._8_4_ = uVar61;
  auVar170._12_4_ = uVar61;
  auVar253 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar2,auVar170);
  uVar61 = local_3c0._0_4_;
  auVar171._4_4_ = uVar61;
  auVar171._0_4_ = uVar61;
  auVar171._8_4_ = uVar61;
  auVar171._12_4_ = uVar61;
  auVar75 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar171);
  uVar61 = local_3d0._0_4_;
  auVar172._4_4_ = uVar61;
  auVar172._0_4_ = uVar61;
  auVar172._8_4_ = uVar61;
  auVar172._12_4_ = uVar61;
  auVar148 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar2,auVar172);
  uVar61 = local_3e0._0_4_;
  auVar173._4_4_ = uVar61;
  auVar173._0_4_ = uVar61;
  auVar173._8_4_ = uVar61;
  auVar173._12_4_ = uVar61;
  auVar139 = vfmadd231ps_fma(auVar139,(undefined1  [16])aVar2,auVar173);
  uVar61 = local_3f0._0_4_;
  auVar174._4_4_ = uVar61;
  auVar174._0_4_ = uVar61;
  auVar174._8_4_ = uVar61;
  auVar174._12_4_ = uVar61;
  auVar63 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar2,auVar174);
  uVar61 = local_400._0_4_;
  auVar175._4_4_ = uVar61;
  auVar175._0_4_ = uVar61;
  auVar175._8_4_ = uVar61;
  auVar175._12_4_ = uVar61;
  auVar149 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar2,auVar175);
  auVar11 = vmovlhps_avx(auVar66,auVar148);
  auVar12 = vmovlhps_avx(auVar94,auVar139);
  auVar13 = vmovlhps_avx(auVar253,auVar63);
  _local_3a0 = vmovlhps_avx(auVar75,auVar149);
  auVar8 = vminps_avx(auVar11,auVar12);
  auVar9 = vminps_avx(auVar13,_local_3a0);
  auVar285 = vminps_avx(auVar8,auVar9);
  auVar8 = vmaxps_avx(auVar11,auVar12);
  auVar9 = vmaxps_avx(auVar13,_local_3a0);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vshufpd_avx(auVar285,auVar285,3);
  auVar285 = vminps_avx(auVar285,auVar9);
  auVar9 = vshufpd_avx(auVar8,auVar8,3);
  auVar9 = vmaxps_avx(auVar8,auVar9);
  auVar8 = vandps_avx(auVar249,auVar285);
  auVar9 = vandps_avx(auVar249,auVar9);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vmovshdup_avx(auVar8);
  auVar8 = vmaxss_avx(auVar9,auVar8);
  fVar87 = auVar8._0_4_ * 9.536743e-07;
  auVar187._8_8_ = auVar66._0_8_;
  auVar187._0_8_ = auVar66._0_8_;
  auVar232._8_8_ = auVar94._0_8_;
  auVar232._0_8_ = auVar94._0_8_;
  auVar252._0_8_ = auVar253._0_8_;
  auVar252._8_8_ = auVar252._0_8_;
  auVar267._0_8_ = auVar75._0_8_;
  auVar267._8_8_ = auVar267._0_8_;
  fStack_358 = -fVar87;
  local_360 = -fVar87;
  fStack_35c = -fVar87;
  fStack_354 = fStack_358;
  fStack_350 = fStack_358;
  fStack_34c = fStack_358;
  fStack_348 = fStack_358;
  fStack_344 = fStack_358;
  local_2c0 = uVar48;
  uStack_2bc = uVar48;
  uStack_2b8 = uVar48;
  uStack_2b4 = uVar48;
  uStack_2b0 = uVar48;
  uStack_2ac = uVar48;
  uStack_2a8 = uVar48;
  uStack_2a4 = uVar48;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  bVar59 = false;
  uVar50 = 0;
  fVar60 = *(float *)(ray + k * 4 + 0x60);
  local_370 = vsubps_avx(auVar12,auVar11);
  local_380 = vsubps_avx(auVar13,auVar12);
  local_390 = vsubps_avx(_local_3a0,auVar13);
  local_430 = vsubps_avx(auVar231,auVar65);
  local_440 = vsubps_avx(auVar68,auVar127);
  local_450 = vsubps_avx(auVar124,auVar95);
  auVar43._4_4_ = fVar181;
  auVar43._0_4_ = fVar163;
  auVar43._8_4_ = fVar182;
  auVar43._12_4_ = fVar183;
  _local_460 = vsubps_avx(auVar43,auVar113);
  auVar70 = ZEXT816(0x3f80000000000000);
  local_340 = fVar87;
  fStack_33c = fVar87;
  fStack_338 = fVar87;
  fStack_334 = fVar87;
  fStack_330 = fVar87;
  fStack_32c = fVar87;
  fStack_328 = fVar87;
  fStack_324 = fVar87;
  local_410 = auVar70;
LAB_0162b8f7:
  auVar8 = vshufps_avx(auVar70,auVar70,0x50);
  auVar284._8_4_ = 0x3f800000;
  auVar284._0_8_ = 0x3f8000003f800000;
  auVar284._12_4_ = 0x3f800000;
  auVar288._16_4_ = 0x3f800000;
  auVar288._0_16_ = auVar284;
  auVar288._20_4_ = 0x3f800000;
  auVar288._24_4_ = 0x3f800000;
  auVar288._28_4_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar284,auVar8);
  fVar89 = auVar8._0_4_;
  fVar138 = auVar148._0_4_;
  auVar71._0_4_ = fVar138 * fVar89;
  fVar91 = auVar8._4_4_;
  fVar147 = auVar148._4_4_;
  auVar71._4_4_ = fVar147 * fVar91;
  fVar123 = auVar8._8_4_;
  auVar71._8_4_ = fVar138 * fVar123;
  fVar88 = auVar8._12_4_;
  auVar71._12_4_ = fVar147 * fVar88;
  fVar248 = auVar139._0_4_;
  auVar176._0_4_ = fVar248 * fVar89;
  fVar262 = auVar139._4_4_;
  auVar176._4_4_ = fVar262 * fVar91;
  auVar176._8_4_ = fVar248 * fVar123;
  auVar176._12_4_ = fVar262 * fVar88;
  fVar200 = auVar63._0_4_;
  auVar141._0_4_ = fVar200 * fVar89;
  fVar212 = auVar63._4_4_;
  auVar141._4_4_ = fVar212 * fVar91;
  auVar141._8_4_ = fVar200 * fVar123;
  auVar141._12_4_ = fVar212 * fVar88;
  fVar213 = auVar149._0_4_;
  auVar116._0_4_ = fVar213 * fVar89;
  fVar228 = auVar149._4_4_;
  auVar116._4_4_ = fVar228 * fVar91;
  auVar116._8_4_ = fVar213 * fVar123;
  auVar116._12_4_ = fVar228 * fVar88;
  auVar94 = vfmadd231ps_fma(auVar71,auVar9,auVar187);
  auVar253 = vfmadd231ps_fma(auVar176,auVar9,auVar232);
  auVar75 = vfmadd231ps_fma(auVar141,auVar9,auVar252);
  auVar184 = vfmadd231ps_fma(auVar116,auVar267,auVar9);
  auVar8 = vmovshdup_avx(local_410);
  fVar89 = local_410._0_4_;
  fStack_228 = (auVar8._0_4_ - fVar89) * 0.04761905;
  auVar226._4_4_ = fVar89;
  auVar226._0_4_ = fVar89;
  auVar226._8_4_ = fVar89;
  auVar226._12_4_ = fVar89;
  auVar226._16_4_ = fVar89;
  auVar226._20_4_ = fVar89;
  auVar226._24_4_ = fVar89;
  auVar226._28_4_ = fVar89;
  auVar108._0_8_ = auVar8._0_8_;
  auVar108._8_8_ = auVar108._0_8_;
  auVar108._16_8_ = auVar108._0_8_;
  auVar108._24_8_ = auVar108._0_8_;
  auVar83 = vsubps_avx(auVar108,auVar226);
  uVar61 = auVar94._0_4_;
  auVar280._4_4_ = uVar61;
  auVar280._0_4_ = uVar61;
  auVar280._8_4_ = uVar61;
  auVar280._12_4_ = uVar61;
  auVar280._16_4_ = uVar61;
  auVar280._20_4_ = uVar61;
  auVar280._24_4_ = uVar61;
  auVar280._28_4_ = uVar61;
  auVar8 = vmovshdup_avx(auVar94);
  uVar93 = auVar8._0_8_;
  auVar273._8_8_ = uVar93;
  auVar273._0_8_ = uVar93;
  auVar273._16_8_ = uVar93;
  auVar273._24_8_ = uVar93;
  fVar263 = auVar253._0_4_;
  auVar259._4_4_ = fVar263;
  auVar259._0_4_ = fVar263;
  auVar259._8_4_ = fVar263;
  auVar259._12_4_ = fVar263;
  auVar259._16_4_ = fVar263;
  auVar259._20_4_ = fVar263;
  auVar259._24_4_ = fVar263;
  auVar259._28_4_ = fVar263;
  auVar9 = vmovshdup_avx(auVar253);
  auVar109._0_8_ = auVar9._0_8_;
  auVar109._8_8_ = auVar109._0_8_;
  auVar109._16_8_ = auVar109._0_8_;
  auVar109._24_8_ = auVar109._0_8_;
  fVar229 = auVar75._0_4_;
  auVar192._4_4_ = fVar229;
  auVar192._0_4_ = fVar229;
  auVar192._8_4_ = fVar229;
  auVar192._12_4_ = fVar229;
  auVar192._16_4_ = fVar229;
  auVar192._20_4_ = fVar229;
  auVar192._24_4_ = fVar229;
  auVar192._28_4_ = fVar229;
  auVar285 = vmovshdup_avx(auVar75);
  auVar210._0_8_ = auVar285._0_8_;
  auVar210._8_8_ = auVar210._0_8_;
  auVar210._16_8_ = auVar210._0_8_;
  auVar210._24_8_ = auVar210._0_8_;
  fVar62 = auVar184._0_4_;
  auVar66 = vmovshdup_avx(auVar184);
  auVar244 = vfmadd132ps_fma(auVar83,auVar226,_DAT_01faff20);
  auVar83 = vsubps_avx(auVar288,ZEXT1632(auVar244));
  fVar89 = auVar244._0_4_;
  fVar91 = auVar244._4_4_;
  auVar15._4_4_ = fVar263 * fVar91;
  auVar15._0_4_ = fVar263 * fVar89;
  fVar123 = auVar244._8_4_;
  auVar15._8_4_ = fVar263 * fVar123;
  fVar88 = auVar244._12_4_;
  auVar15._12_4_ = fVar263 * fVar88;
  auVar15._16_4_ = fVar263 * 0.0;
  auVar15._20_4_ = fVar263 * 0.0;
  auVar15._24_4_ = fVar263 * 0.0;
  auVar15._28_4_ = 0x3f800000;
  auVar244 = vfmadd231ps_fma(auVar15,auVar83,auVar280);
  fVar90 = auVar9._0_4_;
  fVar164 = auVar9._4_4_;
  auVar14._4_4_ = fVar164 * fVar91;
  auVar14._0_4_ = fVar90 * fVar89;
  auVar14._8_4_ = fVar90 * fVar123;
  auVar14._12_4_ = fVar164 * fVar88;
  auVar14._16_4_ = fVar90 * 0.0;
  auVar14._20_4_ = fVar164 * 0.0;
  auVar14._24_4_ = fVar90 * 0.0;
  auVar14._28_4_ = uVar61;
  auVar201 = vfmadd231ps_fma(auVar14,auVar83,auVar273);
  auVar10._4_4_ = fVar229 * fVar91;
  auVar10._0_4_ = fVar229 * fVar89;
  auVar10._8_4_ = fVar229 * fVar123;
  auVar10._12_4_ = fVar229 * fVar88;
  auVar10._16_4_ = fVar229 * 0.0;
  auVar10._20_4_ = fVar229 * 0.0;
  auVar10._24_4_ = fVar229 * 0.0;
  auVar10._28_4_ = auVar8._4_4_;
  auVar214 = vfmadd231ps_fma(auVar10,auVar83,auVar259);
  fVar90 = auVar285._0_4_;
  fVar164 = auVar285._4_4_;
  auVar16._4_4_ = fVar164 * fVar91;
  auVar16._0_4_ = fVar90 * fVar89;
  auVar16._8_4_ = fVar90 * fVar123;
  auVar16._12_4_ = fVar164 * fVar88;
  auVar16._16_4_ = fVar90 * 0.0;
  auVar16._20_4_ = fVar164 * 0.0;
  auVar16._24_4_ = fVar90 * 0.0;
  auVar16._28_4_ = fVar263;
  auVar129 = vfmadd231ps_fma(auVar16,auVar83,auVar109);
  auVar8 = vshufps_avx(auVar94,auVar94,0xaa);
  local_700._8_8_ = auVar8._0_8_;
  local_700._0_8_ = local_700._8_8_;
  local_700._16_8_ = local_700._8_8_;
  local_700._24_8_ = local_700._8_8_;
  auVar9 = vshufps_avx(auVar94,auVar94,0xff);
  uStack_758 = auVar9._0_8_;
  local_760 = (undefined1  [8])uStack_758;
  uStack_750 = uStack_758;
  uStack_748 = uStack_758;
  auVar17._4_4_ = fVar62 * fVar91;
  auVar17._0_4_ = fVar62 * fVar89;
  auVar17._8_4_ = fVar62 * fVar123;
  auVar17._12_4_ = fVar62 * fVar88;
  auVar17._16_4_ = fVar62 * 0.0;
  auVar17._20_4_ = fVar62 * 0.0;
  auVar17._24_4_ = fVar62 * 0.0;
  auVar17._28_4_ = fVar62;
  auVar94 = vfmadd231ps_fma(auVar17,auVar83,auVar192);
  auVar9 = vshufps_avx(auVar253,auVar253,0xaa);
  auVar193._0_8_ = auVar9._0_8_;
  auVar193._8_8_ = auVar193._0_8_;
  auVar193._16_8_ = auVar193._0_8_;
  auVar193._24_8_ = auVar193._0_8_;
  auVar285 = vshufps_avx(auVar253,auVar253,0xff);
  local_600._8_8_ = auVar285._0_8_;
  local_600._0_8_ = local_600._8_8_;
  local_600._16_8_ = local_600._8_8_;
  local_600._24_8_ = local_600._8_8_;
  fVar90 = auVar66._0_4_;
  fVar164 = auVar66._4_4_;
  auVar18._4_4_ = fVar164 * fVar91;
  auVar18._0_4_ = fVar90 * fVar89;
  auVar18._8_4_ = fVar90 * fVar123;
  auVar18._12_4_ = fVar164 * fVar88;
  auVar18._16_4_ = fVar90 * 0.0;
  auVar18._20_4_ = fVar164 * 0.0;
  auVar18._24_4_ = fVar90 * 0.0;
  auVar18._28_4_ = auVar8._4_4_;
  auVar242 = vfmadd231ps_fma(auVar18,auVar83,auVar210);
  auVar19._28_4_ = fVar164;
  auVar19._0_28_ =
       ZEXT1628(CONCAT412(auVar214._12_4_ * fVar88,
                          CONCAT48(auVar214._8_4_ * fVar123,
                                   CONCAT44(auVar214._4_4_ * fVar91,auVar214._0_4_ * fVar89))));
  auVar244 = vfmadd231ps_fma(auVar19,auVar83,ZEXT1632(auVar244));
  fVar90 = auVar285._4_4_;
  auVar261._28_4_ = fVar90;
  auVar261._0_28_ =
       ZEXT1628(CONCAT412(auVar129._12_4_ * fVar88,
                          CONCAT48(auVar129._8_4_ * fVar123,
                                   CONCAT44(auVar129._4_4_ * fVar91,auVar129._0_4_ * fVar89))));
  auVar201 = vfmadd231ps_fma(auVar261,auVar83,ZEXT1632(auVar201));
  auVar8 = vshufps_avx(auVar75,auVar75,0xaa);
  uVar93 = auVar8._0_8_;
  auVar180._8_8_ = uVar93;
  auVar180._0_8_ = uVar93;
  auVar180._16_8_ = uVar93;
  auVar180._24_8_ = uVar93;
  auVar66 = vshufps_avx(auVar75,auVar75,0xff);
  uVar93 = auVar66._0_8_;
  auVar289._8_8_ = uVar93;
  auVar289._0_8_ = uVar93;
  auVar289._16_8_ = uVar93;
  auVar289._24_8_ = uVar93;
  auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar94._12_4_ * fVar88,
                                               CONCAT48(auVar94._8_4_ * fVar123,
                                                        CONCAT44(auVar94._4_4_ * fVar91,
                                                                 auVar94._0_4_ * fVar89)))),auVar83,
                            ZEXT1632(auVar214));
  auVar94 = vshufps_avx(auVar184,auVar184,0xaa);
  auVar253 = vshufps_avx(auVar184,auVar184,0xff);
  auVar184 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar88 * auVar242._12_4_,
                                                CONCAT48(fVar123 * auVar242._8_4_,
                                                         CONCAT44(fVar91 * auVar242._4_4_,
                                                                  fVar89 * auVar242._0_4_)))),
                             auVar83,ZEXT1632(auVar129));
  auVar214 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar88 * auVar75._12_4_,
                                                CONCAT48(fVar123 * auVar75._8_4_,
                                                         CONCAT44(fVar91 * auVar75._4_4_,
                                                                  fVar89 * auVar75._0_4_)))),auVar83
                             ,ZEXT1632(auVar244));
  auVar15 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar244));
  auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar88 * auVar184._12_4_,
                                               CONCAT48(fVar123 * auVar184._8_4_,
                                                        CONCAT44(fVar91 * auVar184._4_4_,
                                                                 fVar89 * auVar184._0_4_)))),auVar83
                            ,ZEXT1632(auVar201));
  auVar84 = vsubps_avx(ZEXT1632(auVar184),ZEXT1632(auVar201));
  fStack_5c4 = auVar84._28_4_;
  auVar260._0_4_ = fStack_228 * auVar15._0_4_ * 3.0;
  auVar260._4_4_ = fStack_228 * auVar15._4_4_ * 3.0;
  auVar260._8_4_ = fStack_228 * auVar15._8_4_ * 3.0;
  auVar260._12_4_ = fStack_228 * auVar15._12_4_ * 3.0;
  auVar260._16_4_ = fStack_228 * auVar15._16_4_ * 3.0;
  auVar260._20_4_ = fStack_228 * auVar15._20_4_ * 3.0;
  auVar260._24_4_ = fStack_228 * auVar15._24_4_ * 3.0;
  auVar260._28_4_ = 0;
  local_5e0._0_4_ = fStack_228 * auVar84._0_4_ * 3.0;
  local_5e0._4_4_ = fStack_228 * auVar84._4_4_ * 3.0;
  fStack_5d8 = fStack_228 * auVar84._8_4_ * 3.0;
  fStack_5d4 = fStack_228 * auVar84._12_4_ * 3.0;
  fStack_5d0 = fStack_228 * auVar84._16_4_ * 3.0;
  fStack_5cc = fStack_228 * auVar84._20_4_ * 3.0;
  fStack_5c8 = fStack_228 * auVar84._24_4_ * 3.0;
  fVar164 = auVar9._0_4_;
  fVar62 = auVar9._4_4_;
  auVar20._4_4_ = fVar62 * fVar91;
  auVar20._0_4_ = fVar164 * fVar89;
  auVar20._8_4_ = fVar164 * fVar123;
  auVar20._12_4_ = fVar62 * fVar88;
  auVar20._16_4_ = fVar164 * 0.0;
  auVar20._20_4_ = fVar62 * 0.0;
  auVar20._24_4_ = fVar164 * 0.0;
  auVar20._28_4_ = fStack_5c4;
  auVar9 = vfmadd231ps_fma(auVar20,auVar83,local_700);
  fVar164 = auVar285._0_4_;
  auVar21._4_4_ = fVar90 * fVar91;
  auVar21._0_4_ = fVar164 * fVar89;
  auVar21._8_4_ = fVar164 * fVar123;
  auVar21._12_4_ = fVar90 * fVar88;
  auVar21._16_4_ = fVar164 * 0.0;
  auVar21._20_4_ = fVar90 * 0.0;
  auVar21._24_4_ = fVar164 * 0.0;
  auVar21._28_4_ = 0;
  auVar285 = vfmadd231ps_fma(auVar21,auVar83,_local_760);
  fVar90 = auVar8._0_4_;
  fVar164 = auVar8._4_4_;
  auVar22._4_4_ = fVar164 * fVar91;
  auVar22._0_4_ = fVar90 * fVar89;
  auVar22._8_4_ = fVar90 * fVar123;
  auVar22._12_4_ = fVar164 * fVar88;
  auVar22._16_4_ = fVar90 * 0.0;
  auVar22._20_4_ = fVar164 * 0.0;
  auVar22._24_4_ = fVar90 * 0.0;
  auVar22._28_4_ = auVar15._28_4_;
  auVar8 = vfmadd231ps_fma(auVar22,auVar83,auVar193);
  fVar90 = auVar66._0_4_;
  fVar229 = auVar66._4_4_;
  auVar23._4_4_ = fVar229 * fVar91;
  auVar23._0_4_ = fVar90 * fVar89;
  auVar23._8_4_ = fVar90 * fVar123;
  auVar23._12_4_ = fVar229 * fVar88;
  auVar23._16_4_ = fVar90 * 0.0;
  auVar23._20_4_ = fVar229 * 0.0;
  auVar23._24_4_ = fVar90 * 0.0;
  auVar23._28_4_ = fVar62;
  auVar66 = vfmadd231ps_fma(auVar23,auVar83,local_600);
  auVar16 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar214));
  fVar90 = auVar94._0_4_;
  fVar164 = auVar94._4_4_;
  auVar24._4_4_ = fVar164 * fVar91;
  auVar24._0_4_ = fVar90 * fVar89;
  auVar24._8_4_ = fVar90 * fVar123;
  auVar24._12_4_ = fVar164 * fVar88;
  auVar24._16_4_ = fVar90 * 0.0;
  auVar24._20_4_ = fVar164 * 0.0;
  auVar24._24_4_ = fVar90 * 0.0;
  auVar24._28_4_ = fVar164;
  auVar94 = vfmadd231ps_fma(auVar24,auVar83,auVar180);
  auVar17 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar75));
  fVar90 = auVar253._0_4_;
  fVar164 = auVar253._4_4_;
  auVar25._4_4_ = fVar164 * fVar91;
  auVar25._0_4_ = fVar90 * fVar89;
  auVar25._8_4_ = fVar90 * fVar123;
  auVar25._12_4_ = fVar164 * fVar88;
  auVar25._16_4_ = fVar90 * 0.0;
  auVar25._20_4_ = fVar164 * 0.0;
  auVar25._24_4_ = fVar90 * 0.0;
  auVar25._28_4_ = fVar164;
  auVar253 = vfmadd231ps_fma(auVar25,auVar83,auVar289);
  auVar26._28_4_ = fVar229;
  auVar26._0_28_ =
       ZEXT1628(CONCAT412(auVar8._12_4_ * fVar88,
                          CONCAT48(auVar8._8_4_ * fVar123,
                                   CONCAT44(auVar8._4_4_ * fVar91,auVar8._0_4_ * fVar89))));
  auVar9 = vfmadd231ps_fma(auVar26,auVar83,ZEXT1632(auVar9));
  auVar285 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar88 * auVar66._12_4_,
                                                CONCAT48(fVar123 * auVar66._8_4_,
                                                         CONCAT44(fVar91 * auVar66._4_4_,
                                                                  fVar89 * auVar66._0_4_)))),auVar83
                             ,ZEXT1632(auVar285));
  auVar110._0_4_ = auVar214._0_4_ + auVar260._0_4_;
  auVar110._4_4_ = auVar214._4_4_ + auVar260._4_4_;
  auVar110._8_4_ = auVar214._8_4_ + auVar260._8_4_;
  auVar110._12_4_ = auVar214._12_4_ + auVar260._12_4_;
  auVar110._16_4_ = auVar260._16_4_ + 0.0;
  auVar110._20_4_ = auVar260._20_4_ + 0.0;
  auVar110._24_4_ = auVar260._24_4_ + 0.0;
  auVar110._28_4_ = 0;
  auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar94._12_4_ * fVar88,
                                              CONCAT48(auVar94._8_4_ * fVar123,
                                                       CONCAT44(auVar94._4_4_ * fVar91,
                                                                auVar94._0_4_ * fVar89)))),auVar83,
                           ZEXT1632(auVar8));
  auVar66 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar253._12_4_ * fVar88,
                                               CONCAT48(auVar253._8_4_ * fVar123,
                                                        CONCAT44(auVar253._4_4_ * fVar91,
                                                                 auVar253._0_4_ * fVar89)))),auVar83
                            ,ZEXT1632(auVar66));
  auVar94 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar88 * auVar8._12_4_,
                                               CONCAT48(fVar123 * auVar8._8_4_,
                                                        CONCAT44(fVar91 * auVar8._4_4_,
                                                                 fVar89 * auVar8._0_4_)))),auVar83,
                            ZEXT1632(auVar9));
  auVar253 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar66._12_4_ * fVar88,
                                                CONCAT48(auVar66._8_4_ * fVar123,
                                                         CONCAT44(auVar66._4_4_ * fVar91,
                                                                  auVar66._0_4_ * fVar89)))),
                             ZEXT1632(auVar285),auVar83);
  auVar83 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar15 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar285));
  auVar281._0_4_ = fStack_228 * auVar83._0_4_ * 3.0;
  auVar281._4_4_ = fStack_228 * auVar83._4_4_ * 3.0;
  auVar281._8_4_ = fStack_228 * auVar83._8_4_ * 3.0;
  auVar281._12_4_ = fStack_228 * auVar83._12_4_ * 3.0;
  auVar281._16_4_ = fStack_228 * auVar83._16_4_ * 3.0;
  auVar281._20_4_ = fStack_228 * auVar83._20_4_ * 3.0;
  auVar281._24_4_ = fStack_228 * auVar83._24_4_ * 3.0;
  auVar281._28_4_ = 0;
  local_240 = fStack_228 * auVar15._0_4_ * 3.0;
  fStack_23c = fStack_228 * auVar15._4_4_ * 3.0;
  auVar27._4_4_ = fStack_23c;
  auVar27._0_4_ = local_240;
  fStack_238 = fStack_228 * auVar15._8_4_ * 3.0;
  auVar27._8_4_ = fStack_238;
  fStack_234 = fStack_228 * auVar15._12_4_ * 3.0;
  auVar27._12_4_ = fStack_234;
  fStack_230 = fStack_228 * auVar15._16_4_ * 3.0;
  auVar27._16_4_ = fStack_230;
  fStack_22c = fStack_228 * auVar15._20_4_ * 3.0;
  auVar27._20_4_ = fStack_22c;
  fStack_228 = fStack_228 * auVar15._24_4_ * 3.0;
  auVar27._24_4_ = fStack_228;
  auVar27._28_4_ = 0x40400000;
  auVar18 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar94));
  local_4a0 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar253));
  auVar83 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar214));
  auVar15 = vsubps_avx(ZEXT1632(auVar253),ZEXT1632(auVar75));
  auVar84 = vsubps_avx(auVar18,auVar16);
  fVar263 = auVar83._0_4_ + auVar84._0_4_;
  fVar264 = auVar83._4_4_ + auVar84._4_4_;
  fVar195 = auVar83._8_4_ + auVar84._8_4_;
  fVar196 = auVar83._12_4_ + auVar84._12_4_;
  fVar197 = auVar83._16_4_ + auVar84._16_4_;
  fVar198 = auVar83._20_4_ + auVar84._20_4_;
  fVar199 = auVar83._24_4_ + auVar84._24_4_;
  auVar14 = vsubps_avx(local_4a0,auVar17);
  auVar85._0_4_ = auVar15._0_4_ + auVar14._0_4_;
  auVar85._4_4_ = auVar15._4_4_ + auVar14._4_4_;
  auVar85._8_4_ = auVar15._8_4_ + auVar14._8_4_;
  auVar85._12_4_ = auVar15._12_4_ + auVar14._12_4_;
  auVar85._16_4_ = auVar15._16_4_ + auVar14._16_4_;
  auVar85._20_4_ = auVar15._20_4_ + auVar14._20_4_;
  auVar85._24_4_ = auVar15._24_4_ + auVar14._24_4_;
  auVar85._28_4_ = auVar15._28_4_ + auVar14._28_4_;
  local_1e0 = ZEXT1632(auVar75);
  fVar89 = auVar75._0_4_;
  local_260 = (float)local_5e0._0_4_ + fVar89;
  fVar91 = auVar75._4_4_;
  fStack_25c = (float)local_5e0._4_4_ + fVar91;
  fVar123 = auVar75._8_4_;
  fStack_258 = fStack_5d8 + fVar123;
  fVar88 = auVar75._12_4_;
  fStack_254 = fStack_5d4 + fVar88;
  fStack_250 = fStack_5d0 + 0.0;
  fStack_24c = fStack_5cc + 0.0;
  fStack_248 = fStack_5c8 + 0.0;
  local_4c0 = ZEXT1632(auVar214);
  auVar15 = vsubps_avx(local_4c0,auVar260);
  local_1c0 = vpermps_avx2(_DAT_01fec480,auVar15);
  auVar15 = vsubps_avx(local_1e0,_local_5e0);
  local_280 = vpermps_avx2(_DAT_01fec480,auVar15);
  local_200._0_4_ = auVar94._0_4_ + auVar281._0_4_;
  local_200._4_4_ = auVar94._4_4_ + auVar281._4_4_;
  local_200._8_4_ = auVar94._8_4_ + auVar281._8_4_;
  local_200._12_4_ = auVar94._12_4_ + auVar281._12_4_;
  local_200._16_4_ = auVar281._16_4_ + 0.0;
  local_200._20_4_ = auVar281._20_4_ + 0.0;
  local_200._24_4_ = auVar281._24_4_ + 0.0;
  local_200._28_4_ = 0;
  auVar227 = ZEXT3264(local_200);
  auVar261 = ZEXT1632(auVar94);
  auVar15 = vsubps_avx(auVar261,auVar281);
  auVar19 = vpermps_avx2(_DAT_01fec480,auVar15);
  fVar90 = auVar253._0_4_;
  local_240 = fVar90 + local_240;
  fVar164 = auVar253._4_4_;
  fStack_23c = fVar164 + fStack_23c;
  fVar62 = auVar253._8_4_;
  fStack_238 = fVar62 + fStack_238;
  fVar229 = auVar253._12_4_;
  fStack_234 = fVar229 + fStack_234;
  fStack_230 = fStack_230 + 0.0;
  fStack_22c = fStack_22c + 0.0;
  fStack_228 = fStack_228 + 0.0;
  auVar15 = vsubps_avx(ZEXT1632(auVar253),auVar27);
  local_220 = vpermps_avx2(_DAT_01fec480,auVar15);
  auVar28._4_4_ = fVar91 * fVar264;
  auVar28._0_4_ = fVar89 * fVar263;
  auVar28._8_4_ = fVar123 * fVar195;
  auVar28._12_4_ = fVar88 * fVar196;
  auVar28._16_4_ = fVar197 * 0.0;
  auVar28._20_4_ = fVar198 * 0.0;
  auVar28._24_4_ = fVar199 * 0.0;
  auVar28._28_4_ = auVar15._28_4_;
  auVar8 = vfnmadd231ps_fma(auVar28,local_4c0,auVar85);
  fStack_244 = fStack_5c4 + 0.0;
  auVar29._4_4_ = fStack_25c * fVar264;
  auVar29._0_4_ = local_260 * fVar263;
  auVar29._8_4_ = fStack_258 * fVar195;
  auVar29._12_4_ = fStack_254 * fVar196;
  auVar29._16_4_ = fStack_250 * fVar197;
  auVar29._20_4_ = fStack_24c * fVar198;
  auVar29._24_4_ = fStack_248 * fVar199;
  auVar29._28_4_ = 0;
  auVar9 = vfnmadd231ps_fma(auVar29,auVar85,auVar110);
  auVar30._4_4_ = local_280._4_4_ * fVar264;
  auVar30._0_4_ = local_280._0_4_ * fVar263;
  auVar30._8_4_ = local_280._8_4_ * fVar195;
  auVar30._12_4_ = local_280._12_4_ * fVar196;
  auVar30._16_4_ = local_280._16_4_ * fVar197;
  auVar30._20_4_ = local_280._20_4_ * fVar198;
  auVar30._24_4_ = local_280._24_4_ * fVar199;
  auVar30._28_4_ = fStack_5c4 + 0.0;
  auVar285 = vfnmadd231ps_fma(auVar30,local_1c0,auVar85);
  local_760._0_4_ = auVar17._0_4_;
  local_760._4_4_ = auVar17._4_4_;
  uStack_758._0_4_ = auVar17._8_4_;
  uStack_758._4_4_ = auVar17._12_4_;
  uStack_750._0_4_ = auVar17._16_4_;
  uStack_750._4_4_ = auVar17._20_4_;
  uStack_748._0_4_ = auVar17._24_4_;
  uStack_748._4_4_ = auVar17._28_4_;
  auVar31._4_4_ = (float)local_760._4_4_ * fVar264;
  auVar31._0_4_ = (float)local_760._0_4_ * fVar263;
  auVar31._8_4_ = (float)uStack_758 * fVar195;
  auVar31._12_4_ = uStack_758._4_4_ * fVar196;
  auVar31._16_4_ = (float)uStack_750 * fVar197;
  auVar31._20_4_ = uStack_750._4_4_ * fVar198;
  auVar31._24_4_ = (float)uStack_748 * fVar199;
  auVar31._28_4_ = uStack_748._4_4_;
  auVar66 = vfnmadd231ps_fma(auVar31,auVar16,auVar85);
  auVar211._0_4_ = fVar90 * fVar263;
  auVar211._4_4_ = fVar164 * fVar264;
  auVar211._8_4_ = fVar62 * fVar195;
  auVar211._12_4_ = fVar229 * fVar196;
  auVar211._16_4_ = fVar197 * 0.0;
  auVar211._20_4_ = fVar198 * 0.0;
  auVar211._24_4_ = fVar199 * 0.0;
  auVar211._28_4_ = 0;
  auVar94 = vfnmadd231ps_fma(auVar211,auVar261,auVar85);
  uStack_224 = 0x40400000;
  auVar32._4_4_ = fStack_23c * fVar264;
  auVar32._0_4_ = local_240 * fVar263;
  auVar32._8_4_ = fStack_238 * fVar195;
  auVar32._12_4_ = fStack_234 * fVar196;
  auVar32._16_4_ = fStack_230 * fVar197;
  auVar32._20_4_ = fStack_22c * fVar198;
  auVar32._24_4_ = fStack_228 * fVar199;
  auVar32._28_4_ = auVar16._28_4_;
  auVar75 = vfnmadd231ps_fma(auVar32,local_200,auVar85);
  auVar33._4_4_ = local_220._4_4_ * fVar264;
  auVar33._0_4_ = local_220._0_4_ * fVar263;
  auVar33._8_4_ = local_220._8_4_ * fVar195;
  auVar33._12_4_ = local_220._12_4_ * fVar196;
  auVar33._16_4_ = local_220._16_4_ * fVar197;
  auVar33._20_4_ = local_220._20_4_ * fVar198;
  auVar33._24_4_ = local_220._24_4_ * fVar199;
  auVar33._28_4_ = local_220._28_4_;
  auVar184 = vfnmadd231ps_fma(auVar33,auVar19,auVar85);
  auVar34._4_4_ = local_4a0._4_4_ * fVar264;
  auVar34._0_4_ = local_4a0._0_4_ * fVar263;
  auVar34._8_4_ = local_4a0._8_4_ * fVar195;
  auVar34._12_4_ = local_4a0._12_4_ * fVar196;
  auVar34._16_4_ = local_4a0._16_4_ * fVar197;
  auVar34._20_4_ = local_4a0._20_4_ * fVar198;
  auVar34._24_4_ = local_4a0._24_4_ * fVar199;
  auVar34._28_4_ = auVar83._28_4_ + auVar84._28_4_;
  auVar244 = vfnmadd231ps_fma(auVar34,auVar18,auVar85);
  auVar15 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar83 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar84 = vminps_avx(ZEXT1632(auVar285),ZEXT1632(auVar66));
  auVar84 = vminps_avx(auVar15,auVar84);
  auVar15 = vmaxps_avx(ZEXT1632(auVar285),ZEXT1632(auVar66));
  auVar83 = vmaxps_avx(auVar83,auVar15);
  auVar14 = vminps_avx(ZEXT1632(auVar94),ZEXT1632(auVar75));
  auVar15 = vmaxps_avx(ZEXT1632(auVar94),ZEXT1632(auVar75));
  auVar10 = vminps_avx(ZEXT1632(auVar184),ZEXT1632(auVar244));
  auVar14 = vminps_avx(auVar14,auVar10);
  auVar14 = vminps_avx(auVar84,auVar14);
  auVar84 = vmaxps_avx(ZEXT1632(auVar184),ZEXT1632(auVar244));
  auVar15 = vmaxps_avx(auVar15,auVar84);
  auVar15 = vmaxps_avx(auVar83,auVar15);
  auVar46._4_4_ = fStack_33c;
  auVar46._0_4_ = local_340;
  auVar46._8_4_ = fStack_338;
  auVar46._12_4_ = fStack_334;
  auVar46._16_4_ = fStack_330;
  auVar46._20_4_ = fStack_32c;
  auVar46._24_4_ = fStack_328;
  auVar46._28_4_ = fStack_324;
  auVar83 = vcmpps_avx(auVar14,auVar46,2);
  auVar44._4_4_ = fStack_35c;
  auVar44._0_4_ = local_360;
  auVar44._8_4_ = fStack_358;
  auVar44._12_4_ = fStack_354;
  auVar44._16_4_ = fStack_350;
  auVar44._20_4_ = fStack_34c;
  auVar44._24_4_ = fStack_348;
  auVar44._28_4_ = fStack_344;
  auVar15 = vcmpps_avx(auVar15,auVar44,5);
  auVar83 = vandps_avx(auVar15,auVar83);
  auVar15 = local_2a0 & auVar83;
  if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0x7f,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar15 >> 0xbf,0) != '\0') ||
      (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0') {
    auVar15 = vsubps_avx(auVar16,local_4c0);
    auVar84 = vsubps_avx(auVar18,auVar261);
    fVar264 = auVar15._0_4_ + auVar84._0_4_;
    fVar195 = auVar15._4_4_ + auVar84._4_4_;
    fVar196 = auVar15._8_4_ + auVar84._8_4_;
    fVar197 = auVar15._12_4_ + auVar84._12_4_;
    fVar198 = auVar15._16_4_ + auVar84._16_4_;
    fVar199 = auVar15._20_4_ + auVar84._20_4_;
    fVar92 = auVar15._24_4_ + auVar84._24_4_;
    auVar14 = vsubps_avx(auVar17,local_1e0);
    auVar10 = vsubps_avx(local_4a0,ZEXT1632(auVar253));
    auVar111._0_4_ = auVar14._0_4_ + auVar10._0_4_;
    auVar111._4_4_ = auVar14._4_4_ + auVar10._4_4_;
    auVar111._8_4_ = auVar14._8_4_ + auVar10._8_4_;
    auVar111._12_4_ = auVar14._12_4_ + auVar10._12_4_;
    auVar111._16_4_ = auVar14._16_4_ + auVar10._16_4_;
    auVar111._20_4_ = auVar14._20_4_ + auVar10._20_4_;
    auVar111._24_4_ = auVar14._24_4_ + auVar10._24_4_;
    fVar263 = auVar10._28_4_;
    auVar111._28_4_ = auVar14._28_4_ + fVar263;
    auVar35._4_4_ = fVar91 * fVar195;
    auVar35._0_4_ = fVar89 * fVar264;
    auVar35._8_4_ = fVar123 * fVar196;
    auVar35._12_4_ = fVar88 * fVar197;
    auVar35._16_4_ = fVar198 * 0.0;
    auVar35._20_4_ = fVar199 * 0.0;
    auVar35._24_4_ = fVar92 * 0.0;
    auVar35._28_4_ = auVar18._28_4_;
    auVar94 = vfnmadd231ps_fma(auVar35,auVar111,local_4c0);
    auVar36._4_4_ = fVar195 * fStack_25c;
    auVar36._0_4_ = fVar264 * local_260;
    auVar36._8_4_ = fVar196 * fStack_258;
    auVar36._12_4_ = fVar197 * fStack_254;
    auVar36._16_4_ = fVar198 * fStack_250;
    auVar36._20_4_ = fVar199 * fStack_24c;
    auVar36._24_4_ = fVar92 * fStack_248;
    auVar36._28_4_ = 0;
    auVar8 = vfnmadd213ps_fma(auVar110,auVar111,auVar36);
    auVar37._4_4_ = fVar195 * local_280._4_4_;
    auVar37._0_4_ = fVar264 * local_280._0_4_;
    auVar37._8_4_ = fVar196 * local_280._8_4_;
    auVar37._12_4_ = fVar197 * local_280._12_4_;
    auVar37._16_4_ = fVar198 * local_280._16_4_;
    auVar37._20_4_ = fVar199 * local_280._20_4_;
    auVar37._24_4_ = fVar92 * local_280._24_4_;
    auVar37._28_4_ = 0;
    auVar9 = vfnmadd213ps_fma(local_1c0,auVar111,auVar37);
    auVar38._4_4_ = (float)local_760._4_4_ * fVar195;
    auVar38._0_4_ = (float)local_760._0_4_ * fVar264;
    auVar38._8_4_ = (float)uStack_758 * fVar196;
    auVar38._12_4_ = uStack_758._4_4_ * fVar197;
    auVar38._16_4_ = (float)uStack_750 * fVar198;
    auVar38._20_4_ = uStack_750._4_4_ * fVar199;
    auVar38._24_4_ = (float)uStack_748 * fVar92;
    auVar38._28_4_ = 0;
    auVar253 = vfnmadd231ps_fma(auVar38,auVar111,auVar16);
    auVar136._0_4_ = fVar90 * fVar264;
    auVar136._4_4_ = fVar164 * fVar195;
    auVar136._8_4_ = fVar62 * fVar196;
    auVar136._12_4_ = fVar229 * fVar197;
    auVar136._16_4_ = fVar198 * 0.0;
    auVar136._20_4_ = fVar199 * 0.0;
    auVar136._24_4_ = fVar92 * 0.0;
    auVar136._28_4_ = 0;
    auVar75 = vfnmadd231ps_fma(auVar136,auVar111,auVar261);
    auVar39._4_4_ = fVar195 * fStack_23c;
    auVar39._0_4_ = fVar264 * local_240;
    auVar39._8_4_ = fVar196 * fStack_238;
    auVar39._12_4_ = fVar197 * fStack_234;
    auVar39._16_4_ = fVar198 * fStack_230;
    auVar39._20_4_ = fVar199 * fStack_22c;
    auVar39._24_4_ = fVar92 * fStack_228;
    auVar39._28_4_ = fVar263;
    auVar285 = vfnmadd213ps_fma(local_200,auVar111,auVar39);
    auVar40._4_4_ = fVar195 * local_220._4_4_;
    auVar40._0_4_ = fVar264 * local_220._0_4_;
    auVar40._8_4_ = fVar196 * local_220._8_4_;
    auVar40._12_4_ = fVar197 * local_220._12_4_;
    auVar40._16_4_ = fVar198 * local_220._16_4_;
    auVar40._20_4_ = fVar199 * local_220._20_4_;
    auVar40._24_4_ = fVar92 * local_220._24_4_;
    auVar40._28_4_ = fVar263;
    auVar66 = vfnmadd213ps_fma(auVar19,auVar111,auVar40);
    auVar227 = ZEXT1664(auVar66);
    auVar41._4_4_ = local_4a0._4_4_ * fVar195;
    auVar41._0_4_ = local_4a0._0_4_ * fVar264;
    auVar41._8_4_ = local_4a0._8_4_ * fVar196;
    auVar41._12_4_ = local_4a0._12_4_ * fVar197;
    auVar41._16_4_ = local_4a0._16_4_ * fVar198;
    auVar41._20_4_ = local_4a0._20_4_ * fVar199;
    auVar41._24_4_ = local_4a0._24_4_ * fVar92;
    auVar41._28_4_ = auVar15._28_4_ + auVar84._28_4_;
    auVar184 = vfnmadd231ps_fma(auVar41,auVar18,auVar111);
    auVar84 = vminps_avx(ZEXT1632(auVar94),ZEXT1632(auVar8));
    auVar15 = vmaxps_avx(ZEXT1632(auVar94),ZEXT1632(auVar8));
    auVar14 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar253));
    auVar14 = vminps_avx(auVar84,auVar14);
    auVar84 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar253));
    auVar15 = vmaxps_avx(auVar15,auVar84);
    auVar10 = vminps_avx(ZEXT1632(auVar75),ZEXT1632(auVar285));
    auVar84 = vmaxps_avx(ZEXT1632(auVar75),ZEXT1632(auVar285));
    auVar16 = vminps_avx(ZEXT1632(auVar66),ZEXT1632(auVar184));
    auVar10 = vminps_avx(auVar10,auVar16);
    auVar10 = vminps_avx(auVar14,auVar10);
    auVar14 = vmaxps_avx(ZEXT1632(auVar66),ZEXT1632(auVar184));
    auVar84 = vmaxps_avx(auVar84,auVar14);
    auVar84 = vmaxps_avx(auVar15,auVar84);
    auVar47._4_4_ = fStack_33c;
    auVar47._0_4_ = local_340;
    auVar47._8_4_ = fStack_338;
    auVar47._12_4_ = fStack_334;
    auVar47._16_4_ = fStack_330;
    auVar47._20_4_ = fStack_32c;
    auVar47._24_4_ = fStack_328;
    auVar47._28_4_ = fStack_324;
    auVar15 = vcmpps_avx(auVar10,auVar47,2);
    auVar45._4_4_ = fStack_35c;
    auVar45._0_4_ = local_360;
    auVar45._8_4_ = fStack_358;
    auVar45._12_4_ = fStack_354;
    auVar45._16_4_ = fStack_350;
    auVar45._20_4_ = fStack_34c;
    auVar45._24_4_ = fStack_348;
    auVar45._28_4_ = fStack_344;
    auVar84 = vcmpps_avx(auVar84,auVar45,5);
    auVar15 = vandps_avx(auVar84,auVar15);
    auVar83 = vandps_avx(local_2a0,auVar83);
    auVar84 = auVar83 & auVar15;
    if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar84 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar84 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar84 >> 0x7f,0) != '\0') ||
          (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar84 >> 0xbf,0) != '\0') ||
        (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar84[0x1f] < '\0')
    {
      auVar83 = vandps_avx(auVar15,auVar83);
      uVar54 = vmovmskps_avx(auVar83);
      if (uVar54 != 0) {
        auStack_500[uVar50] = uVar54 & 0xff;
        uVar93 = vmovlps_avx(local_410);
        *(undefined8 *)(&uStack_320 + uVar50 * 2) = uVar93;
        uVar58 = vmovlps_avx(auVar70);
        auStack_1a0[uVar50] = uVar58;
        uVar50 = (ulong)((int)uVar50 + 1);
      }
    }
  }
LAB_0162beaf:
  if ((int)uVar50 != 0) {
    uVar55 = (int)uVar50 - 1;
    uVar56 = (ulong)uVar55;
    uVar52 = auStack_500[uVar56];
    uVar54 = (&uStack_320)[uVar56 * 2];
    fVar89 = afStack_31c[uVar56 * 2];
    iVar49 = 0;
    for (uVar58 = (ulong)uVar52; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      iVar49 = iVar49 + 1;
    }
    uVar52 = uVar52 - 1 & uVar52;
    if (uVar52 == 0) {
      uVar50 = (ulong)uVar55;
    }
    auVar70._8_8_ = 0;
    auVar70._0_8_ = auStack_1a0[uVar56];
    auStack_500[uVar56] = uVar52;
    fVar91 = (float)(iVar49 + 1) * 0.14285715;
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar89 * (float)iVar49 * 0.14285715)),ZEXT416(uVar54),
                             ZEXT416((uint)(1.0 - (float)iVar49 * 0.14285715)));
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar89 * fVar91)),ZEXT416(uVar54),
                             ZEXT416((uint)(1.0 - fVar91)));
    fVar91 = auVar9._0_4_;
    auVar194._0_4_ = auVar8._0_4_;
    fVar89 = fVar91 - auVar194._0_4_;
    if (fVar89 < 0.16666667) {
      auVar285 = vshufps_avx(auVar70,auVar70,0x50);
      auVar101._8_4_ = 0x3f800000;
      auVar101._0_8_ = 0x3f8000003f800000;
      auVar101._12_4_ = 0x3f800000;
      auVar66 = vsubps_avx(auVar101,auVar285);
      fVar123 = auVar285._0_4_;
      auVar142._0_4_ = fVar123 * fVar138;
      fVar88 = auVar285._4_4_;
      auVar142._4_4_ = fVar88 * fVar147;
      fVar90 = auVar285._8_4_;
      auVar142._8_4_ = fVar90 * fVar138;
      fVar164 = auVar285._12_4_;
      auVar142._12_4_ = fVar164 * fVar147;
      auVar153._0_4_ = fVar123 * fVar248;
      auVar153._4_4_ = fVar88 * fVar262;
      auVar153._8_4_ = fVar90 * fVar248;
      auVar153._12_4_ = fVar164 * fVar262;
      auVar177._0_4_ = fVar123 * fVar200;
      auVar177._4_4_ = fVar88 * fVar212;
      auVar177._8_4_ = fVar90 * fVar200;
      auVar177._12_4_ = fVar164 * fVar212;
      auVar72._0_4_ = fVar123 * fVar213;
      auVar72._4_4_ = fVar88 * fVar228;
      auVar72._8_4_ = fVar90 * fVar213;
      auVar72._12_4_ = fVar164 * fVar228;
      auVar285 = vfmadd231ps_fma(auVar142,auVar66,auVar187);
      auVar94 = vfmadd231ps_fma(auVar153,auVar66,auVar232);
      auVar253 = vfmadd231ps_fma(auVar177,auVar66,auVar252);
      auVar66 = vfmadd231ps_fma(auVar72,auVar66,auVar267);
      auVar137._16_16_ = auVar285;
      auVar137._0_16_ = auVar285;
      auVar146._16_16_ = auVar94;
      auVar146._0_16_ = auVar94;
      auVar162._16_16_ = auVar253;
      auVar162._0_16_ = auVar253;
      auVar194._4_4_ = auVar194._0_4_;
      auVar194._8_4_ = auVar194._0_4_;
      auVar194._12_4_ = auVar194._0_4_;
      auVar194._20_4_ = fVar91;
      auVar194._16_4_ = fVar91;
      auVar194._24_4_ = fVar91;
      auVar194._28_4_ = fVar91;
      auVar83 = vsubps_avx(auVar146,auVar137);
      auVar94 = vfmadd213ps_fma(auVar83,auVar194,auVar137);
      auVar83 = vsubps_avx(auVar162,auVar146);
      auVar75 = vfmadd213ps_fma(auVar83,auVar194,auVar146);
      auVar285 = vsubps_avx(auVar66,auVar253);
      auVar86._16_16_ = auVar285;
      auVar86._0_16_ = auVar285;
      auVar285 = vfmadd213ps_fma(auVar86,auVar194,auVar162);
      auVar83 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar94));
      auVar66 = vfmadd213ps_fma(auVar83,auVar194,ZEXT1632(auVar94));
      auVar83 = vsubps_avx(ZEXT1632(auVar285),ZEXT1632(auVar75));
      auVar285 = vfmadd213ps_fma(auVar83,auVar194,ZEXT1632(auVar75));
      auVar83 = vsubps_avx(ZEXT1632(auVar285),ZEXT1632(auVar66));
      auVar201 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar83,auVar194);
      fVar229 = auVar83._4_4_ * 3.0;
      fVar123 = fVar89 * 0.33333334;
      local_4a0._0_8_ =
           CONCAT44(auVar201._4_4_ + fVar123 * fVar229,
                    auVar201._0_4_ + fVar123 * auVar83._0_4_ * 3.0);
      local_4a0._8_4_ = auVar201._8_4_ + fVar123 * auVar83._8_4_ * 3.0;
      local_4a0._12_4_ = auVar201._12_4_ + fVar123 * auVar83._12_4_ * 3.0;
      auVar66 = vshufpd_avx(auVar201,auVar201,3);
      auVar94 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar285 = vsubps_avx(auVar66,auVar201);
      auVar253 = vsubps_avx(auVar94,(undefined1  [16])0x0);
      auVar73._0_4_ = auVar285._0_4_ + auVar253._0_4_;
      auVar73._4_4_ = auVar285._4_4_ + auVar253._4_4_;
      auVar73._8_4_ = auVar285._8_4_ + auVar253._8_4_;
      auVar73._12_4_ = auVar285._12_4_ + auVar253._12_4_;
      auVar285 = vshufps_avx(auVar201,auVar201,0xb1);
      auVar253 = vshufps_avx(local_4a0._0_16_,local_4a0._0_16_,0xb1);
      auVar277._4_4_ = auVar73._0_4_;
      auVar277._0_4_ = auVar73._0_4_;
      auVar277._8_4_ = auVar73._0_4_;
      auVar277._12_4_ = auVar73._0_4_;
      auVar75 = vshufps_avx(auVar73,auVar73,0x55);
      fVar88 = auVar75._0_4_;
      auVar74._0_4_ = fVar88 * auVar285._0_4_;
      fVar90 = auVar75._4_4_;
      auVar74._4_4_ = fVar90 * auVar285._4_4_;
      fVar164 = auVar75._8_4_;
      auVar74._8_4_ = fVar164 * auVar285._8_4_;
      fVar62 = auVar75._12_4_;
      auVar74._12_4_ = fVar62 * auVar285._12_4_;
      auVar154._0_4_ = fVar88 * auVar253._0_4_;
      auVar154._4_4_ = fVar90 * auVar253._4_4_;
      auVar154._8_4_ = fVar164 * auVar253._8_4_;
      auVar154._12_4_ = fVar62 * auVar253._12_4_;
      auVar184 = vfmadd231ps_fma(auVar74,auVar277,auVar201);
      auVar244 = vfmadd231ps_fma(auVar154,auVar277,local_4a0._0_16_);
      auVar253 = vshufps_avx(auVar184,auVar184,0xe8);
      auVar75 = vshufps_avx(auVar244,auVar244,0xe8);
      auVar285 = vcmpps_avx(auVar253,auVar75,1);
      uVar54 = vextractps_avx(auVar285,0);
      auVar214 = auVar244;
      if ((uVar54 & 1) == 0) {
        auVar214 = auVar184;
      }
      auVar128._0_4_ = fVar123 * auVar83._16_4_ * 3.0;
      auVar128._4_4_ = fVar123 * fVar229;
      auVar128._8_4_ = fVar123 * auVar83._24_4_ * 3.0;
      auVar128._12_4_ = fVar123 * auVar227._28_4_;
      local_4c0._0_16_ = vsubps_avx((undefined1  [16])0x0,auVar128);
      auVar129 = vshufps_avx(local_4c0._0_16_,local_4c0._0_16_,0xb1);
      auVar242 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar188._0_4_ = fVar88 * auVar129._0_4_;
      auVar188._4_4_ = fVar90 * auVar129._4_4_;
      auVar188._8_4_ = fVar164 * auVar129._8_4_;
      auVar188._12_4_ = fVar62 * auVar129._12_4_;
      auVar205._0_4_ = auVar242._0_4_ * fVar88;
      auVar205._4_4_ = auVar242._4_4_ * fVar90;
      auVar205._8_4_ = auVar242._8_4_ * fVar164;
      auVar205._12_4_ = auVar242._12_4_ * fVar62;
      auVar275 = vfmadd231ps_fma(auVar188,auVar277,local_4c0._0_16_);
      auVar97 = vfmadd231ps_fma(auVar205,(undefined1  [16])0x0,auVar277);
      auVar242 = vshufps_avx(auVar275,auVar275,0xe8);
      auVar274 = vshufps_avx(auVar97,auVar97,0xe8);
      auVar227 = ZEXT1664(auVar274);
      auVar129 = vcmpps_avx(auVar242,auVar274,1);
      uVar54 = vextractps_avx(auVar129,0);
      auVar233 = auVar97;
      if ((uVar54 & 1) == 0) {
        auVar233 = auVar275;
      }
      auVar214 = vmaxss_avx(auVar233,auVar214);
      auVar253 = vminps_avx(auVar253,auVar75);
      auVar75 = vminps_avx(auVar242,auVar274);
      auVar75 = vminps_avx(auVar253,auVar75);
      auVar285 = vshufps_avx(auVar285,auVar285,0x55);
      auVar285 = vblendps_avx(auVar285,auVar129,2);
      auVar129 = vpslld_avx(auVar285,0x1f);
      auVar285 = vshufpd_avx(auVar244,auVar244,1);
      auVar285 = vinsertps_avx(auVar285,auVar97,0x9c);
      auVar253 = vshufpd_avx(auVar184,auVar184,1);
      auVar253 = vinsertps_avx(auVar253,auVar275,0x9c);
      auVar285 = vblendvps_avx(auVar253,auVar285,auVar129);
      auVar253 = vmovshdup_avx(auVar285);
      auVar285 = vmaxss_avx(auVar253,auVar285);
      fVar164 = auVar75._0_4_;
      auVar253 = vmovshdup_avx(auVar75);
      fVar90 = auVar285._0_4_;
      fVar123 = auVar253._0_4_;
      fVar88 = auVar214._0_4_;
      if (((0.0001 <= fVar164) || (fVar90 <= -0.0001)) && (0.0001 <= fVar123 || fVar90 <= -0.0001))
      goto code_r0x0162c1cc;
      goto LAB_0162c1f3;
    }
    local_410 = vinsertps_avx(auVar8,auVar9,0x10);
    goto LAB_0162b8f7;
  }
  if (bVar59) {
    return bVar59;
  }
  uVar61 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar82._4_4_ = uVar61;
  auVar82._0_4_ = uVar61;
  auVar82._8_4_ = uVar61;
  auVar82._12_4_ = uVar61;
  auVar8 = vcmpps_avx(local_420,auVar82,2);
  uVar48 = vmovmskps_avx(auVar8);
  uVar48 = (uint)uVar57 & uVar48;
  if (uVar48 == 0) {
    return bVar59;
  }
  goto LAB_0162b10b;
code_r0x0162c1cc:
  auVar253 = vcmpps_avx(auVar253,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar184 = vcmpps_avx(auVar75,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar253 = vandps_avx(auVar184,auVar253);
  if (fVar88 <= -0.0001 || (auVar253 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_0162beaf;
LAB_0162c1f3:
  auVar184 = vcmpps_avx(auVar75,_DAT_01f7aa10,1);
  auVar244 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar253 = vcmpss_avx(auVar214,ZEXT816(0) << 0x20,1);
  auVar117._8_4_ = 0xbf800000;
  auVar117._0_8_ = 0xbf800000bf800000;
  auVar117._12_4_ = 0xbf800000;
  auVar253 = vblendvps_avx(auVar101,auVar117,auVar253);
  auVar184 = vblendvps_avx(auVar101,auVar117,auVar184);
  fVar229 = auVar184._0_4_;
  fVar62 = auVar253._0_4_;
  auVar253 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar229 == fVar62) && (!NAN(fVar229) && !NAN(fVar62))) {
    auVar253 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar229 == fVar62) && (!NAN(fVar229) && !NAN(fVar62))) {
    auVar244 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar184 = vmovshdup_avx(auVar184);
  fVar263 = auVar184._0_4_;
  if ((fVar229 != fVar263) || (NAN(fVar229) || NAN(fVar263))) {
    auVar189._12_4_ = 0;
    auVar189._0_12_ = ZEXT812(0);
    auVar189 = auVar189 << 0x20;
    if ((fVar123 != fVar164) || (NAN(fVar123) || NAN(fVar164))) {
      auVar130._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
      auVar130._8_4_ = auVar75._8_4_ ^ 0x80000000;
      auVar130._12_4_ = auVar75._12_4_ ^ 0x80000000;
      auVar131._0_4_ = -fVar164 / (fVar123 - fVar164);
      auVar131._4_12_ = auVar130._4_12_;
      auVar75 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar131._0_4_)),auVar189,auVar131);
      auVar184 = auVar75;
    }
    else {
      auVar75 = ZEXT816(0) << 0x20;
      if ((fVar164 != 0.0) || (auVar184 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar164))) {
        auVar75 = SUB6416(ZEXT464(0x7f800000),0);
        auVar184 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar253 = vminss_avx(auVar253,auVar75);
    auVar244 = vmaxss_avx(auVar184,auVar244);
  }
  else {
    auVar42._12_4_ = 0;
    auVar42._0_12_ = ZEXT812(0);
    auVar189 = auVar42 << 0x20;
  }
  auVar285 = vcmpss_avx(auVar285,auVar189,1);
  auVar118._8_4_ = 0xbf800000;
  auVar118._0_8_ = 0xbf800000bf800000;
  auVar118._12_4_ = 0xbf800000;
  auVar285 = vblendvps_avx(auVar101,auVar118,auVar285);
  fVar123 = auVar285._0_4_;
  auVar285 = SUB6416(ZEXT464(0x3f800000),0);
  if ((fVar62 != fVar123) || (NAN(fVar62) || NAN(fVar123))) {
    if ((fVar90 != fVar88) || (NAN(fVar90) || NAN(fVar88))) {
      auVar76._0_8_ = auVar214._0_8_ ^ 0x8000000080000000;
      auVar76._8_4_ = auVar214._8_4_ ^ 0x80000000;
      auVar76._12_4_ = auVar214._12_4_ ^ 0x80000000;
      auVar132._0_4_ = -fVar88 / (fVar90 - fVar88);
      auVar132._4_12_ = auVar76._4_12_;
      auVar75 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar132._0_4_)),auVar189,auVar132);
      auVar184 = auVar75;
    }
    else {
      auVar75 = ZEXT816(0) << 0x20;
      if ((fVar88 != 0.0) || (auVar184 = auVar285, NAN(fVar88))) {
        auVar75 = SUB6416(ZEXT464(0x7f800000),0);
        auVar184 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar253 = vminss_avx(auVar253,auVar75);
    auVar244 = vmaxss_avx(auVar184,auVar244);
  }
  if ((fVar263 != fVar123) || (NAN(fVar263) || NAN(fVar123))) {
    auVar253 = vminss_avx(auVar253,auVar285);
    auVar244 = vmaxss_avx(auVar285,auVar244);
  }
  auVar253 = vmaxss_avx(auVar189,auVar253);
  auVar75 = vminss_avx(auVar244,auVar285);
  if (auVar75._0_4_ < auVar253._0_4_) goto LAB_0162beaf;
  auVar253 = vmaxss_avx(auVar189,ZEXT416((uint)(auVar253._0_4_ + -0.1)));
  auVar285 = vminss_avx(ZEXT416((uint)(auVar75._0_4_ + 0.1)),auVar285);
  auVar143._0_8_ = auVar201._0_8_;
  auVar143._8_8_ = auVar143._0_8_;
  auVar219._8_8_ = local_4a0._0_8_;
  auVar219._0_8_ = local_4a0._0_8_;
  auVar234._8_8_ = local_4c0._0_8_;
  auVar234._0_8_ = local_4c0._0_8_;
  auVar75 = vshufpd_avx(local_4a0._0_16_,local_4a0._0_16_,3);
  auVar184 = vshufpd_avx(local_4c0._0_16_,local_4c0._0_16_,3);
  auVar244 = vshufps_avx(auVar253,auVar285,0);
  auVar201 = vsubps_avx(auVar101,auVar244);
  local_5e0._0_4_ = auVar66._0_4_;
  local_5e0._4_4_ = auVar66._4_4_;
  fStack_5d8 = auVar66._8_4_;
  fStack_5d4 = auVar66._12_4_;
  fVar123 = auVar244._0_4_;
  auVar77._0_4_ = fVar123 * (float)local_5e0._0_4_;
  fVar88 = auVar244._4_4_;
  auVar77._4_4_ = fVar88 * (float)local_5e0._4_4_;
  fVar90 = auVar244._8_4_;
  auVar77._8_4_ = fVar90 * fStack_5d8;
  fVar164 = auVar244._12_4_;
  auVar77._12_4_ = fVar164 * fStack_5d4;
  auVar178._0_4_ = fVar123 * auVar75._0_4_;
  auVar178._4_4_ = fVar88 * auVar75._4_4_;
  auVar178._8_4_ = fVar90 * auVar75._8_4_;
  auVar178._12_4_ = fVar164 * auVar75._12_4_;
  auVar190._0_4_ = fVar123 * auVar184._0_4_;
  auVar190._4_4_ = fVar88 * auVar184._4_4_;
  auVar190._8_4_ = fVar90 * auVar184._8_4_;
  auVar190._12_4_ = fVar164 * auVar184._12_4_;
  local_5c0 = auVar94._0_4_;
  fStack_5bc = auVar94._4_4_;
  fStack_5b8 = auVar94._8_4_;
  fStack_5b4 = auVar94._12_4_;
  auVar206._0_4_ = fVar123 * local_5c0;
  auVar206._4_4_ = fVar88 * fStack_5bc;
  auVar206._8_4_ = fVar90 * fStack_5b8;
  auVar206._12_4_ = fVar164 * fStack_5b4;
  auVar75 = vfmadd231ps_fma(auVar77,auVar201,auVar143);
  auVar184 = vfmadd231ps_fma(auVar178,auVar201,auVar219);
  auVar244 = vfmadd231ps_fma(auVar190,auVar201,auVar234);
  auVar201 = vfmadd231ps_fma(auVar206,auVar201,ZEXT816(0));
  auVar66 = vmovshdup_avx(auVar70);
  auVar275 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar253._0_4_)),auVar70,
                             ZEXT416((uint)(1.0 - auVar253._0_4_)));
  auVar70 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar285._0_4_)),auVar70,
                            ZEXT416((uint)(1.0 - auVar285._0_4_)));
  fVar123 = 1.0 / fVar89;
  auVar285 = vsubps_avx(auVar184,auVar75);
  auVar220._0_4_ = auVar285._0_4_ * 3.0;
  auVar220._4_4_ = auVar285._4_4_ * 3.0;
  auVar220._8_4_ = auVar285._8_4_ * 3.0;
  auVar220._12_4_ = auVar285._12_4_ * 3.0;
  auVar285 = vsubps_avx(auVar244,auVar184);
  auVar235._0_4_ = auVar285._0_4_ * 3.0;
  auVar235._4_4_ = auVar285._4_4_ * 3.0;
  auVar235._8_4_ = auVar285._8_4_ * 3.0;
  auVar235._12_4_ = auVar285._12_4_ * 3.0;
  auVar285 = vsubps_avx(auVar201,auVar244);
  auVar245._0_4_ = auVar285._0_4_ * 3.0;
  auVar245._4_4_ = auVar285._4_4_ * 3.0;
  auVar245._8_4_ = auVar285._8_4_ * 3.0;
  auVar245._12_4_ = auVar285._12_4_ * 3.0;
  auVar66 = vminps_avx(auVar235,auVar245);
  auVar285 = vmaxps_avx(auVar235,auVar245);
  auVar66 = vminps_avx(auVar220,auVar66);
  auVar285 = vmaxps_avx(auVar220,auVar285);
  auVar94 = vshufpd_avx(auVar66,auVar66,3);
  auVar253 = vshufpd_avx(auVar285,auVar285,3);
  auVar66 = vminps_avx(auVar66,auVar94);
  auVar285 = vmaxps_avx(auVar285,auVar253);
  auVar236._0_4_ = auVar66._0_4_ * fVar123;
  auVar236._4_4_ = auVar66._4_4_ * fVar123;
  auVar236._8_4_ = auVar66._8_4_ * fVar123;
  auVar236._12_4_ = auVar66._12_4_ * fVar123;
  auVar221._0_4_ = auVar285._0_4_ * fVar123;
  auVar221._4_4_ = auVar285._4_4_ * fVar123;
  auVar221._8_4_ = auVar285._8_4_ * fVar123;
  auVar221._12_4_ = auVar285._12_4_ * fVar123;
  fVar123 = 1.0 / (auVar70._0_4_ - auVar275._0_4_);
  auVar285 = vshufpd_avx(auVar75,auVar75,3);
  auVar66 = vshufpd_avx(auVar184,auVar184,3);
  auVar94 = vshufpd_avx(auVar244,auVar244,3);
  auVar253 = vshufpd_avx(auVar201,auVar201,3);
  auVar285 = vsubps_avx(auVar285,auVar75);
  auVar75 = vsubps_avx(auVar66,auVar184);
  auVar184 = vsubps_avx(auVar94,auVar244);
  auVar253 = vsubps_avx(auVar253,auVar201);
  auVar66 = vminps_avx(auVar285,auVar75);
  auVar285 = vmaxps_avx(auVar285,auVar75);
  auVar94 = vminps_avx(auVar184,auVar253);
  auVar94 = vminps_avx(auVar66,auVar94);
  auVar66 = vmaxps_avx(auVar184,auVar253);
  auVar285 = vmaxps_avx(auVar285,auVar66);
  auVar268._0_4_ = fVar123 * auVar94._0_4_;
  auVar268._4_4_ = fVar123 * auVar94._4_4_;
  auVar268._8_4_ = fVar123 * auVar94._8_4_;
  auVar268._12_4_ = fVar123 * auVar94._12_4_;
  auVar254._0_4_ = fVar123 * auVar285._0_4_;
  auVar254._4_4_ = fVar123 * auVar285._4_4_;
  auVar254._8_4_ = fVar123 * auVar285._8_4_;
  auVar254._12_4_ = fVar123 * auVar285._12_4_;
  auVar253 = vinsertps_avx(auVar8,auVar275,0x10);
  auVar75 = vinsertps_avx(auVar9,auVar70,0x10);
  auVar246._0_4_ = (auVar253._0_4_ + auVar75._0_4_) * 0.5;
  auVar246._4_4_ = (auVar253._4_4_ + auVar75._4_4_) * 0.5;
  auVar246._8_4_ = (auVar253._8_4_ + auVar75._8_4_) * 0.5;
  auVar246._12_4_ = (auVar253._12_4_ + auVar75._12_4_) * 0.5;
  auVar78._4_4_ = auVar246._0_4_;
  auVar78._0_4_ = auVar246._0_4_;
  auVar78._8_4_ = auVar246._0_4_;
  auVar78._12_4_ = auVar246._0_4_;
  auVar285 = vfmadd213ps_fma(local_370,auVar78,auVar11);
  auVar66 = vfmadd213ps_fma(local_380,auVar78,auVar12);
  auVar94 = vfmadd213ps_fma(local_390,auVar78,auVar13);
  auVar9 = vsubps_avx(auVar66,auVar285);
  auVar285 = vfmadd213ps_fma(auVar9,auVar78,auVar285);
  auVar9 = vsubps_avx(auVar94,auVar66);
  auVar9 = vfmadd213ps_fma(auVar9,auVar78,auVar66);
  auVar9 = vsubps_avx(auVar9,auVar285);
  auVar285 = vfmadd231ps_fma(auVar285,auVar9,auVar78);
  auVar79._0_8_ = CONCAT44(auVar9._4_4_ * 3.0,auVar9._0_4_ * 3.0);
  auVar79._8_4_ = auVar9._8_4_ * 3.0;
  auVar79._12_4_ = auVar9._12_4_ * 3.0;
  auVar278._8_8_ = auVar285._0_8_;
  auVar278._0_8_ = auVar285._0_8_;
  auVar9 = vshufpd_avx(auVar285,auVar285,3);
  auVar285 = vshufps_avx(auVar246,auVar246,0x55);
  auVar244 = vsubps_avx(auVar9,auVar278);
  auVar214 = vfmadd231ps_fma(auVar278,auVar285,auVar244);
  auVar286._8_8_ = auVar79._0_8_;
  auVar286._0_8_ = auVar79._0_8_;
  auVar9 = vshufpd_avx(auVar79,auVar79,3);
  auVar9 = vsubps_avx(auVar9,auVar286);
  auVar201 = vfmadd213ps_fma(auVar9,auVar285,auVar286);
  auVar285 = vmovshdup_avx(auVar201);
  auVar287._0_8_ = auVar285._0_8_ ^ 0x8000000080000000;
  auVar287._8_4_ = auVar285._8_4_ ^ 0x80000000;
  auVar287._12_4_ = auVar285._12_4_ ^ 0x80000000;
  auVar66 = vmovshdup_avx(auVar244);
  auVar9 = vunpcklps_avx(auVar66,auVar287);
  auVar94 = vshufps_avx(auVar9,auVar287,4);
  auVar184 = vshufps_avx(auVar246,auVar246,0x54);
  auVar133._0_8_ = auVar244._0_8_ ^ 0x8000000080000000;
  auVar133._8_4_ = auVar244._8_4_ ^ 0x80000000;
  auVar133._12_4_ = auVar244._12_4_ ^ 0x80000000;
  auVar9 = vmovlhps_avx(auVar133,auVar201);
  auVar9 = vshufps_avx(auVar9,auVar201,8);
  auVar285 = vfmsub231ss_fma(ZEXT416((uint)(auVar244._0_4_ * auVar285._0_4_)),auVar66,auVar201);
  uVar61 = auVar285._0_4_;
  auVar80._4_4_ = uVar61;
  auVar80._0_4_ = uVar61;
  auVar80._8_4_ = uVar61;
  auVar80._12_4_ = uVar61;
  auVar285 = vdivps_avx(auVar94,auVar80);
  auVar66 = vdivps_avx(auVar9,auVar80);
  fVar90 = auVar214._0_4_;
  fVar123 = auVar285._0_4_;
  auVar9 = vshufps_avx(auVar214,auVar214,0x55);
  fVar88 = auVar66._0_4_;
  auVar81._0_4_ = fVar90 * fVar123 + auVar9._0_4_ * fVar88;
  auVar81._4_4_ = fVar90 * auVar285._4_4_ + auVar9._4_4_ * auVar66._4_4_;
  auVar81._8_4_ = fVar90 * auVar285._8_4_ + auVar9._8_4_ * auVar66._8_4_;
  auVar81._12_4_ = fVar90 * auVar285._12_4_ + auVar9._12_4_ * auVar66._12_4_;
  auVar274 = vsubps_avx(auVar184,auVar81);
  auVar184 = vmovshdup_avx(auVar285);
  auVar9 = vinsertps_avx(auVar236,auVar268,0x1c);
  auVar155._0_4_ = auVar184._0_4_ * auVar9._0_4_;
  auVar155._4_4_ = auVar184._4_4_ * auVar9._4_4_;
  auVar155._8_4_ = auVar184._8_4_ * auVar9._8_4_;
  auVar155._12_4_ = auVar184._12_4_ * auVar9._12_4_;
  auVar94 = vinsertps_avx(auVar221,auVar254,0x1c);
  auVar102._0_4_ = auVar94._0_4_ * auVar184._0_4_;
  auVar102._4_4_ = auVar94._4_4_ * auVar184._4_4_;
  auVar102._8_4_ = auVar94._8_4_ * auVar184._8_4_;
  auVar102._12_4_ = auVar94._12_4_ * auVar184._12_4_;
  auVar214 = vminps_avx(auVar155,auVar102);
  auVar201 = vmaxps_avx(auVar102,auVar155);
  auVar184 = vinsertps_avx(auVar268,auVar236,0x4c);
  auVar129 = vmovshdup_avx(auVar66);
  auVar244 = vinsertps_avx(auVar254,auVar221,0x4c);
  auVar255._0_4_ = auVar129._0_4_ * auVar184._0_4_;
  auVar255._4_4_ = auVar129._4_4_ * auVar184._4_4_;
  auVar255._8_4_ = auVar129._8_4_ * auVar184._8_4_;
  auVar255._12_4_ = auVar129._12_4_ * auVar184._12_4_;
  auVar237._0_4_ = auVar129._0_4_ * auVar244._0_4_;
  auVar237._4_4_ = auVar129._4_4_ * auVar244._4_4_;
  auVar237._8_4_ = auVar129._8_4_ * auVar244._8_4_;
  auVar237._12_4_ = auVar129._12_4_ * auVar244._12_4_;
  auVar129 = vminps_avx(auVar255,auVar237);
  auVar269._0_4_ = auVar214._0_4_ + auVar129._0_4_;
  auVar269._4_4_ = auVar214._4_4_ + auVar129._4_4_;
  auVar269._8_4_ = auVar214._8_4_ + auVar129._8_4_;
  auVar269._12_4_ = auVar214._12_4_ + auVar129._12_4_;
  auVar214 = vmaxps_avx(auVar237,auVar255);
  auVar103._0_4_ = auVar214._0_4_ + auVar201._0_4_;
  auVar103._4_4_ = auVar214._4_4_ + auVar201._4_4_;
  auVar103._8_4_ = auVar214._8_4_ + auVar201._8_4_;
  auVar103._12_4_ = auVar214._12_4_ + auVar201._12_4_;
  auVar238._8_8_ = 0x3f80000000000000;
  auVar238._0_8_ = 0x3f80000000000000;
  auVar201 = vsubps_avx(auVar238,auVar103);
  auVar214 = vsubps_avx(auVar238,auVar269);
  auVar129 = vsubps_avx(auVar253,auVar246);
  auVar242 = vsubps_avx(auVar75,auVar246);
  auVar119._0_4_ = fVar123 * auVar9._0_4_;
  auVar119._4_4_ = fVar123 * auVar9._4_4_;
  auVar119._8_4_ = fVar123 * auVar9._8_4_;
  auVar119._12_4_ = fVar123 * auVar9._12_4_;
  auVar270._0_4_ = fVar123 * auVar94._0_4_;
  auVar270._4_4_ = fVar123 * auVar94._4_4_;
  auVar270._8_4_ = fVar123 * auVar94._8_4_;
  auVar270._12_4_ = fVar123 * auVar94._12_4_;
  auVar94 = vminps_avx(auVar119,auVar270);
  auVar9 = vmaxps_avx(auVar270,auVar119);
  auVar156._0_4_ = fVar88 * auVar184._0_4_;
  auVar156._4_4_ = fVar88 * auVar184._4_4_;
  auVar156._8_4_ = fVar88 * auVar184._8_4_;
  auVar156._12_4_ = fVar88 * auVar184._12_4_;
  auVar222._0_4_ = fVar88 * auVar244._0_4_;
  auVar222._4_4_ = fVar88 * auVar244._4_4_;
  auVar222._8_4_ = fVar88 * auVar244._8_4_;
  auVar222._12_4_ = fVar88 * auVar244._12_4_;
  auVar184 = vminps_avx(auVar156,auVar222);
  auVar271._0_4_ = auVar94._0_4_ + auVar184._0_4_;
  auVar271._4_4_ = auVar94._4_4_ + auVar184._4_4_;
  auVar271._8_4_ = auVar94._8_4_ + auVar184._8_4_;
  auVar271._12_4_ = auVar94._12_4_ + auVar184._12_4_;
  fVar263 = auVar129._0_4_;
  auVar279._0_4_ = fVar263 * auVar201._0_4_;
  fVar264 = auVar129._4_4_;
  auVar279._4_4_ = fVar264 * auVar201._4_4_;
  fVar195 = auVar129._8_4_;
  auVar279._8_4_ = fVar195 * auVar201._8_4_;
  fVar196 = auVar129._12_4_;
  auVar279._12_4_ = fVar196 * auVar201._12_4_;
  auVar94 = vmaxps_avx(auVar222,auVar156);
  auVar223._0_4_ = fVar263 * auVar214._0_4_;
  auVar223._4_4_ = fVar264 * auVar214._4_4_;
  auVar223._8_4_ = fVar195 * auVar214._8_4_;
  auVar223._12_4_ = fVar196 * auVar214._12_4_;
  fVar90 = auVar242._0_4_;
  auVar104._0_4_ = fVar90 * auVar201._0_4_;
  fVar164 = auVar242._4_4_;
  auVar104._4_4_ = fVar164 * auVar201._4_4_;
  fVar62 = auVar242._8_4_;
  auVar104._8_4_ = fVar62 * auVar201._8_4_;
  fVar229 = auVar242._12_4_;
  auVar104._12_4_ = fVar229 * auVar201._12_4_;
  auVar239._0_4_ = fVar90 * auVar214._0_4_;
  auVar239._4_4_ = fVar164 * auVar214._4_4_;
  auVar239._8_4_ = fVar62 * auVar214._8_4_;
  auVar239._12_4_ = fVar229 * auVar214._12_4_;
  auVar120._0_4_ = auVar9._0_4_ + auVar94._0_4_;
  auVar120._4_4_ = auVar9._4_4_ + auVar94._4_4_;
  auVar120._8_4_ = auVar9._8_4_ + auVar94._8_4_;
  auVar120._12_4_ = auVar9._12_4_ + auVar94._12_4_;
  auVar157._8_8_ = 0x3f800000;
  auVar157._0_8_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar157,auVar120);
  auVar94 = vsubps_avx(auVar157,auVar271);
  auVar272._0_4_ = fVar263 * auVar9._0_4_;
  auVar272._4_4_ = fVar264 * auVar9._4_4_;
  auVar272._8_4_ = fVar195 * auVar9._8_4_;
  auVar272._12_4_ = fVar196 * auVar9._12_4_;
  auVar256._0_4_ = fVar263 * auVar94._0_4_;
  auVar256._4_4_ = fVar264 * auVar94._4_4_;
  auVar256._8_4_ = fVar195 * auVar94._8_4_;
  auVar256._12_4_ = fVar196 * auVar94._12_4_;
  auVar121._0_4_ = fVar90 * auVar9._0_4_;
  auVar121._4_4_ = fVar164 * auVar9._4_4_;
  auVar121._8_4_ = fVar62 * auVar9._8_4_;
  auVar121._12_4_ = fVar229 * auVar9._12_4_;
  auVar158._0_4_ = fVar90 * auVar94._0_4_;
  auVar158._4_4_ = fVar164 * auVar94._4_4_;
  auVar158._8_4_ = fVar62 * auVar94._8_4_;
  auVar158._12_4_ = fVar229 * auVar94._12_4_;
  auVar9 = vminps_avx(auVar272,auVar256);
  auVar94 = vminps_avx(auVar121,auVar158);
  auVar9 = vminps_avx(auVar9,auVar94);
  auVar94 = vmaxps_avx(auVar256,auVar272);
  auVar184 = vmaxps_avx(auVar158,auVar121);
  auVar244 = vminps_avx(auVar279,auVar223);
  auVar201 = vminps_avx(auVar104,auVar239);
  auVar244 = vminps_avx(auVar244,auVar201);
  auVar9 = vhaddps_avx(auVar9,auVar244);
  auVar94 = vmaxps_avx(auVar184,auVar94);
  auVar184 = vmaxps_avx(auVar223,auVar279);
  auVar244 = vmaxps_avx(auVar239,auVar104);
  auVar184 = vmaxps_avx(auVar244,auVar184);
  auVar94 = vhaddps_avx(auVar94,auVar184);
  auVar9 = vshufps_avx(auVar9,auVar9,0xe8);
  auVar94 = vshufps_avx(auVar94,auVar94,0xe8);
  auVar240._0_4_ = auVar274._0_4_ + auVar9._0_4_;
  auVar240._4_4_ = auVar274._4_4_ + auVar9._4_4_;
  auVar240._8_4_ = auVar274._8_4_ + auVar9._8_4_;
  auVar240._12_4_ = auVar274._12_4_ + auVar9._12_4_;
  auVar224._0_4_ = auVar274._0_4_ + auVar94._0_4_;
  auVar224._4_4_ = auVar274._4_4_ + auVar94._4_4_;
  auVar224._8_4_ = auVar274._8_4_ + auVar94._8_4_;
  auVar224._12_4_ = auVar274._12_4_ + auVar94._12_4_;
  auVar227 = ZEXT1664(auVar224);
  auVar9 = vmaxps_avx(auVar253,auVar240);
  auVar94 = vminps_avx(auVar224,auVar75);
  auVar9 = vcmpps_avx(auVar94,auVar9,1);
  auVar9 = vshufps_avx(auVar9,auVar9,0x50);
  if ((auVar9 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar9[0xf] < '\0')
  goto LAB_0162beaf;
  bVar51 = 0;
  if ((auVar194._0_4_ < auVar240._0_4_) && (bVar51 = 0, auVar224._0_4_ < auVar75._0_4_)) {
    auVar94 = vmovshdup_avx(auVar240);
    auVar9 = vcmpps_avx(auVar224,auVar75,1);
    bVar51 = auVar9[4] & auVar275._0_4_ < auVar94._0_4_;
  }
  if (((3 < (uint)uVar50 || fVar89 < 0.001) | bVar51) == 1) {
    lVar53 = 200;
    auVar227 = ZEXT1664(auVar13);
    do {
      fVar164 = auVar274._0_4_;
      fVar90 = 1.0 - fVar164;
      fVar89 = fVar90 * fVar90 * fVar90;
      fVar91 = fVar164 * 3.0 * fVar90 * fVar90;
      fVar90 = fVar90 * fVar164 * fVar164 * 3.0;
      auVar144._4_4_ = fVar89;
      auVar144._0_4_ = fVar89;
      auVar144._8_4_ = fVar89;
      auVar144._12_4_ = fVar89;
      auVar122._4_4_ = fVar91;
      auVar122._0_4_ = fVar91;
      auVar122._8_4_ = fVar91;
      auVar122._12_4_ = fVar91;
      auVar105._4_4_ = fVar90;
      auVar105._0_4_ = fVar90;
      auVar105._8_4_ = fVar90;
      auVar105._12_4_ = fVar90;
      fVar164 = fVar164 * fVar164 * fVar164;
      auVar159._0_4_ = (float)local_3a0._0_4_ * fVar164;
      auVar159._4_4_ = (float)local_3a0._4_4_ * fVar164;
      auVar159._8_4_ = fStack_398 * fVar164;
      auVar159._12_4_ = fStack_394 * fVar164;
      auVar8 = vfmadd231ps_fma(auVar159,auVar13,auVar105);
      auVar8 = vfmadd231ps_fma(auVar8,auVar12,auVar122);
      auVar8 = vfmadd231ps_fma(auVar8,auVar11,auVar144);
      auVar106._8_8_ = auVar8._0_8_;
      auVar106._0_8_ = auVar8._0_8_;
      auVar8 = vshufpd_avx(auVar8,auVar8,3);
      auVar9 = vshufps_avx(auVar274,auVar274,0x55);
      auVar8 = vsubps_avx(auVar8,auVar106);
      auVar9 = vfmadd213ps_fma(auVar8,auVar9,auVar106);
      fVar89 = auVar9._0_4_;
      auVar8 = vshufps_avx(auVar9,auVar9,0x55);
      auVar107._0_4_ = fVar123 * fVar89 + fVar88 * auVar8._0_4_;
      auVar107._4_4_ = auVar285._4_4_ * fVar89 + auVar66._4_4_ * auVar8._4_4_;
      auVar107._8_4_ = auVar285._8_4_ * fVar89 + auVar66._8_4_ * auVar8._8_4_;
      auVar107._12_4_ = auVar285._12_4_ * fVar89 + auVar66._12_4_ * auVar8._12_4_;
      auVar274 = vsubps_avx(auVar274,auVar107);
      auVar8 = vandps_avx(auVar249,auVar9);
      auVar9 = vshufps_avx(auVar8,auVar8,0xf5);
      auVar8 = vmaxss_avx(auVar9,auVar8);
      if (auVar8._0_4_ < fVar87) {
        local_120 = auVar274._0_4_;
        if ((0.0 <= local_120) && (local_120 <= 1.0)) {
          auVar8 = vmovshdup_avx(auVar274);
          fVar89 = auVar8._0_4_;
          if ((0.0 <= fVar89) && (fVar89 <= 1.0)) {
            auVar9 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                   ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
            auVar244 = vinsertps_avx(auVar9,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28
                                    );
            auVar9 = vdpps_avx(auVar244,auVar64,0x7f);
            auVar285 = vdpps_avx(auVar244,auVar96,0x7f);
            auVar66 = vdpps_avx(auVar244,local_3b0,0x7f);
            auVar94 = vdpps_avx(auVar244,local_3c0,0x7f);
            auVar253 = vdpps_avx(auVar244,local_3d0,0x7f);
            auVar75 = vdpps_avx(auVar244,local_3e0,0x7f);
            auVar184 = vdpps_avx(auVar244,local_3f0,0x7f);
            auVar244 = vdpps_avx(auVar244,local_400,0x7f);
            fVar91 = 1.0 - fVar89;
            auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar89 * auVar253._0_4_)),ZEXT416((uint)fVar91),
                                     auVar9);
            auVar285 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * fVar89)),ZEXT416((uint)fVar91)
                                       ,auVar285);
            auVar227 = ZEXT1664(auVar285);
            auVar66 = vfmadd231ss_fma(ZEXT416((uint)(auVar184._0_4_ * fVar89)),ZEXT416((uint)fVar91)
                                      ,auVar66);
            auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar89 * auVar244._0_4_)),ZEXT416((uint)fVar91)
                                      ,auVar94);
            fVar88 = 1.0 - local_120;
            fVar89 = fVar88 * local_120 * local_120 * 3.0;
            fVar164 = local_120 * local_120 * local_120;
            auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar164 * auVar94._0_4_)),ZEXT416((uint)fVar89)
                                      ,auVar66);
            fVar91 = local_120 * 3.0 * fVar88 * fVar88;
            auVar285 = vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar91),auVar285);
            fVar123 = fVar88 * fVar88 * fVar88;
            auVar9 = vfmadd231ss_fma(auVar285,ZEXT416((uint)fVar123),auVar9);
            fVar90 = auVar9._0_4_;
            if ((fVar60 <= fVar90) && (fVar62 = *(float *)(ray + k * 4 + 0x100), fVar90 <= fVar62))
            {
              pGVar4 = (context->scene->geometries).items[uVar48].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_0162ccc7:
                bVar51 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar51 = 1, pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar9 = vshufps_avx(auVar274,auVar274,0x55);
                auVar225._8_4_ = 0x3f800000;
                auVar225._0_8_ = 0x3f8000003f800000;
                auVar225._12_4_ = 0x3f800000;
                auVar285 = vsubps_avx(auVar225,auVar9);
                fVar229 = auVar9._0_4_;
                auVar241._0_4_ = fVar229 * auVar231._0_4_;
                fVar263 = auVar9._4_4_;
                auVar241._4_4_ = fVar263 * auVar231._4_4_;
                fVar264 = auVar9._8_4_;
                auVar241._8_4_ = fVar264 * auVar231._8_4_;
                fVar195 = auVar9._12_4_;
                auVar241._12_4_ = fVar195 * auVar231._12_4_;
                auVar247._0_4_ = fVar229 * auVar68._0_4_;
                auVar247._4_4_ = fVar263 * auVar68._4_4_;
                auVar247._8_4_ = fVar264 * auVar68._8_4_;
                auVar247._12_4_ = fVar195 * auVar68._12_4_;
                local_5a0 = auVar124._0_4_;
                fStack_59c = auVar124._4_4_;
                fStack_598 = auVar124._8_4_;
                fStack_594 = auVar124._12_4_;
                auVar257._0_4_ = fVar229 * local_5a0;
                auVar257._4_4_ = fVar263 * fStack_59c;
                auVar257._8_4_ = fVar264 * fStack_598;
                auVar257._12_4_ = fVar195 * fStack_594;
                auVar207._0_4_ = fVar229 * fVar163;
                auVar207._4_4_ = fVar263 * fVar181;
                auVar207._8_4_ = fVar264 * fVar182;
                auVar207._12_4_ = fVar195 * fVar183;
                auVar9 = vfmadd231ps_fma(auVar241,auVar285,auVar65);
                auVar66 = vfmadd231ps_fma(auVar247,auVar285,auVar127);
                auVar94 = vfmadd231ps_fma(auVar257,auVar285,auVar95);
                auVar253 = vfmadd231ps_fma(auVar207,auVar285,auVar113);
                auVar285 = vsubps_avx(auVar66,auVar9);
                auVar227 = ZEXT1664(auVar285);
                auVar9 = vsubps_avx(auVar94,auVar66);
                auVar66 = vsubps_avx(auVar253,auVar94);
                auVar258._0_4_ = local_120 * auVar9._0_4_;
                auVar258._4_4_ = local_120 * auVar9._4_4_;
                auVar258._8_4_ = local_120 * auVar9._8_4_;
                auVar258._12_4_ = local_120 * auVar9._12_4_;
                auVar191._4_4_ = fVar88;
                auVar191._0_4_ = fVar88;
                auVar191._8_4_ = fVar88;
                auVar191._12_4_ = fVar88;
                auVar94 = vfmadd231ps_fma(auVar258,auVar191,auVar285);
                auVar208._0_4_ = local_120 * auVar66._0_4_;
                auVar208._4_4_ = local_120 * auVar66._4_4_;
                auVar208._8_4_ = local_120 * auVar66._8_4_;
                auVar208._12_4_ = local_120 * auVar66._12_4_;
                auVar9 = vfmadd231ps_fma(auVar208,auVar191,auVar9);
                auVar209._0_4_ = local_120 * auVar9._0_4_;
                auVar209._4_4_ = local_120 * auVar9._4_4_;
                auVar209._8_4_ = local_120 * auVar9._8_4_;
                auVar209._12_4_ = local_120 * auVar9._12_4_;
                auVar66 = vfmadd231ps_fma(auVar209,auVar191,auVar94);
                auVar179._0_4_ = fVar164 * (float)local_460._0_4_;
                auVar179._4_4_ = fVar164 * (float)local_460._4_4_;
                auVar179._8_4_ = fVar164 * fStack_458;
                auVar179._12_4_ = fVar164 * fStack_454;
                auVar134._4_4_ = fVar89;
                auVar134._0_4_ = fVar89;
                auVar134._8_4_ = fVar89;
                auVar134._12_4_ = fVar89;
                auVar9 = vfmadd132ps_fma(auVar134,auVar179,local_450);
                auVar160._4_4_ = fVar91;
                auVar160._0_4_ = fVar91;
                auVar160._8_4_ = fVar91;
                auVar160._12_4_ = fVar91;
                auVar9 = vfmadd132ps_fma(auVar160,auVar9,local_440);
                auVar135._0_4_ = auVar66._0_4_ * 3.0;
                auVar135._4_4_ = auVar66._4_4_ * 3.0;
                auVar135._8_4_ = auVar66._8_4_ * 3.0;
                auVar135._12_4_ = auVar66._12_4_ * 3.0;
                auVar145._4_4_ = fVar123;
                auVar145._0_4_ = fVar123;
                auVar145._8_4_ = fVar123;
                auVar145._12_4_ = fVar123;
                auVar66 = vfmadd132ps_fma(auVar145,auVar9,local_430);
                auVar9 = vshufps_avx(auVar135,auVar135,0xc9);
                auVar161._0_4_ = auVar66._0_4_ * auVar9._0_4_;
                auVar161._4_4_ = auVar66._4_4_ * auVar9._4_4_;
                auVar161._8_4_ = auVar66._8_4_ * auVar9._8_4_;
                auVar161._12_4_ = auVar66._12_4_ * auVar9._12_4_;
                auVar9 = vshufps_avx(auVar66,auVar66,0xc9);
                auVar66 = vfmsub231ps_fma(auVar161,auVar135,auVar9);
                auVar9 = vmovshdup_avx(auVar66);
                local_180 = auVar9._0_8_;
                uStack_178 = local_180;
                uStack_170 = local_180;
                uStack_168 = local_180;
                auVar9 = vshufps_avx(auVar66,auVar66,0xaa);
                local_160 = auVar9._0_8_;
                uStack_158 = local_160;
                uStack_150 = local_160;
                uStack_148 = local_160;
                local_140 = auVar66._0_4_;
                uStack_13c = local_140;
                uStack_138 = local_140;
                uStack_134 = local_140;
                uStack_130 = local_140;
                uStack_12c = local_140;
                uStack_128 = local_140;
                uStack_124 = local_140;
                fStack_11c = local_120;
                fStack_118 = local_120;
                fStack_114 = local_120;
                fStack_110 = local_120;
                fStack_10c = local_120;
                fStack_108 = local_120;
                fStack_104 = local_120;
                local_100 = auVar8._0_8_;
                uStack_f8 = local_100;
                uStack_f0 = local_100;
                uStack_e8 = local_100;
                local_e0 = CONCAT44(uStack_2dc,local_2e0);
                uStack_d8 = CONCAT44(uStack_2d4,uStack_2d8);
                uStack_d0 = CONCAT44(uStack_2cc,uStack_2d0);
                uStack_c8 = CONCAT44(uStack_2c4,uStack_2c8);
                local_c0._4_4_ = uStack_2bc;
                local_c0._0_4_ = local_2c0;
                local_c0._8_4_ = uStack_2b8;
                local_c0._12_4_ = uStack_2b4;
                local_c0._16_4_ = uStack_2b0;
                local_c0._20_4_ = uStack_2ac;
                local_c0._24_4_ = uStack_2a8;
                local_c0._28_4_ = uStack_2a4;
                vpcmpeqd_avx2(local_c0,local_c0);
                uStack_9c = context->user->instID[0];
                local_a0 = uStack_9c;
                uStack_98 = uStack_9c;
                uStack_94 = uStack_9c;
                uStack_90 = uStack_9c;
                uStack_8c = uStack_9c;
                uStack_88 = uStack_9c;
                uStack_84 = uStack_9c;
                uStack_7c = context->user->instPrimID[0];
                local_80 = uStack_7c;
                uStack_78 = uStack_7c;
                uStack_74 = uStack_7c;
                uStack_70 = uStack_7c;
                uStack_6c = uStack_7c;
                uStack_68 = uStack_7c;
                uStack_64 = uStack_7c;
                *(float *)(ray + k * 4 + 0x100) = fVar90;
                local_480 = local_300;
                local_4f0.valid = (int *)local_480;
                local_4f0.geometryUserPtr = pGVar4->userPtr;
                local_4f0.context = context->user;
                local_4f0.ray = (RTCRayN *)ray;
                local_4f0.hit = (RTCHitN *)&local_180;
                local_4f0.N = 8;
                if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar227 = ZEXT1664(auVar285);
                  (*pGVar4->occlusionFilterN)(&local_4f0);
                }
                auVar83 = vpcmpeqd_avx2(local_480,_DAT_01faff00);
                auVar83 = _DAT_01fe9960 & ~auVar83;
                if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar83 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar83 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar83 >> 0x7f,0) != '\0') ||
                      (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar83 >> 0xbf,0) != '\0') ||
                    (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar83[0x1f] < '\0') {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar227 = ZEXT1664(auVar227._0_16_);
                    (*p_Var5)(&local_4f0);
                  }
                  auVar15 = vpcmpeqd_avx2(local_480,_DAT_01faff00);
                  auVar112._8_4_ = 0xff800000;
                  auVar112._0_8_ = 0xff800000ff800000;
                  auVar112._12_4_ = 0xff800000;
                  auVar112._16_4_ = 0xff800000;
                  auVar112._20_4_ = 0xff800000;
                  auVar112._24_4_ = 0xff800000;
                  auVar112._28_4_ = 0xff800000;
                  auVar83 = vblendvps_avx(auVar112,*(undefined1 (*) [32])(local_4f0.ray + 0x100),
                                          auVar15);
                  *(undefined1 (*) [32])(local_4f0.ray + 0x100) = auVar83;
                  auVar83 = _DAT_01fe9960 & ~auVar15;
                  if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar83 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar83 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar83 >> 0x7f,0) != '\0') ||
                        (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar83 >> 0xbf,0) != '\0') ||
                      (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar83[0x1f] < '\0') {
                    bVar51 = 1;
                    goto LAB_0162ccc9;
                  }
                }
                *(float *)(ray + k * 4 + 0x100) = fVar62;
                goto LAB_0162ccc7;
              }
LAB_0162ccc9:
              bVar59 = (bool)(bVar59 | bVar51);
            }
          }
        }
        break;
      }
      lVar53 = lVar53 + -1;
    } while (lVar53 != 0);
    goto LAB_0162beaf;
  }
  local_410 = vinsertps_avx(auVar8,ZEXT416((uint)fVar91),0x10);
  auVar70 = vinsertps_avx(auVar275,ZEXT416((uint)auVar70._0_4_),0x10);
  goto LAB_0162b8f7;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }